

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  undefined8 unaff_R13;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar80 [64];
  undefined1 auVar82 [64];
  undefined1 auVar48 [16];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar90 [64];
  float fVar91;
  undefined4 uVar92;
  vint4 bi_2;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  vint4 bi_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  vfloat4 b0;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  vint4 ai_2;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  vint4 bi;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  vint4 ai;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  vint4 ai_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar155;
  float fVar163;
  float fVar164;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar182;
  __m128 a;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar191;
  float fVar201;
  float fVar203;
  float fVar205;
  undefined1 auVar192 [16];
  float fVar202;
  float fVar204;
  float fVar206;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar207;
  float fVar208;
  float fVar217;
  float fVar218;
  vfloat4 a0_1;
  undefined1 auVar209 [16];
  float fVar219;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  vfloat4 a0;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint auStack_640 [4];
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar21;
  undefined1 auVar79 [64];
  undefined1 auVar81 [64];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  float fVar126;
  float fVar136;
  
  uVar20 = (ulong)(byte)prim[1];
  fVar91 = *(float *)(prim + uVar20 * 0x19 + 0x12);
  auVar30 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar31 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar30 = vsubps_avx(auVar30,*(undefined1 (*) [16])(prim + uVar20 * 0x19 + 6));
  auVar50._0_4_ = fVar91 * auVar30._0_4_;
  auVar50._4_4_ = fVar91 * auVar30._4_4_;
  auVar50._8_4_ = fVar91 * auVar30._8_4_;
  auVar50._12_4_ = fVar91 * auVar30._12_4_;
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 4 + 6)));
  auVar39._0_4_ = fVar91 * auVar31._0_4_;
  auVar39._4_4_ = fVar91 * auVar31._4_4_;
  auVar39._8_4_ = fVar91 * auVar31._8_4_;
  auVar39._12_4_ = fVar91 * auVar31._12_4_;
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 5 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 6 + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 0xb + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 0xc + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 0xd + 6)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 0x12 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 0x13 + 6)));
  auVar238 = vcvtdq2ps_avx(auVar238);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 0x14 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar55._4_4_ = auVar39._0_4_;
  auVar55._0_4_ = auVar39._0_4_;
  auVar55._8_4_ = auVar39._0_4_;
  auVar55._12_4_ = auVar39._0_4_;
  auVar33 = vshufps_avx(auVar39,auVar39,0x55);
  auVar35 = vshufps_avx(auVar39,auVar39,0xaa);
  fVar91 = auVar35._0_4_;
  auVar127._0_4_ = fVar91 * auVar32._0_4_;
  fVar207 = auVar35._4_4_;
  auVar127._4_4_ = fVar207 * auVar32._4_4_;
  fVar191 = auVar35._8_4_;
  auVar127._8_4_ = fVar191 * auVar32._8_4_;
  fVar202 = auVar35._12_4_;
  auVar127._12_4_ = fVar202 * auVar32._12_4_;
  auVar53._0_4_ = auVar38._0_4_ * fVar91;
  auVar53._4_4_ = auVar38._4_4_ * fVar207;
  auVar53._8_4_ = auVar38._8_4_ * fVar191;
  auVar53._12_4_ = auVar38._12_4_ * fVar202;
  auVar40._0_4_ = fVar91 * auVar34._0_4_;
  auVar40._4_4_ = fVar207 * auVar34._4_4_;
  auVar40._8_4_ = fVar191 * auVar34._8_4_;
  auVar40._12_4_ = fVar202 * auVar34._12_4_;
  auVar35 = vfmadd231ps_fma(auVar127,auVar33,auVar31);
  auVar36 = vfmadd231ps_fma(auVar53,auVar33,auVar42);
  auVar33 = vfmadd231ps_fma(auVar40,auVar238,auVar33);
  auVar37 = vfmadd231ps_fma(auVar35,auVar55,auVar30);
  auVar36 = vfmadd231ps_fma(auVar36,auVar55,auVar41);
  auVar39 = vfmadd231ps_fma(auVar33,auVar43,auVar55);
  auVar220._4_4_ = auVar50._0_4_;
  auVar220._0_4_ = auVar50._0_4_;
  auVar220._8_4_ = auVar50._0_4_;
  auVar220._12_4_ = auVar50._0_4_;
  auVar33 = vshufps_avx(auVar50,auVar50,0x55);
  auVar35 = vshufps_avx(auVar50,auVar50,0xaa);
  fVar91 = auVar35._0_4_;
  auVar54._0_4_ = fVar91 * auVar32._0_4_;
  fVar207 = auVar35._4_4_;
  auVar54._4_4_ = fVar207 * auVar32._4_4_;
  fVar191 = auVar35._8_4_;
  auVar54._8_4_ = fVar191 * auVar32._8_4_;
  fVar202 = auVar35._12_4_;
  auVar54._12_4_ = fVar202 * auVar32._12_4_;
  auVar48._0_4_ = fVar91 * auVar38._0_4_;
  auVar48._4_4_ = fVar207 * auVar38._4_4_;
  auVar48._8_4_ = fVar191 * auVar38._8_4_;
  auVar48._12_4_ = fVar202 * auVar38._12_4_;
  auVar47._0_4_ = fVar91 * auVar34._0_4_;
  auVar47._4_4_ = fVar207 * auVar34._4_4_;
  auVar47._8_4_ = fVar191 * auVar34._8_4_;
  auVar47._12_4_ = fVar202 * auVar34._12_4_;
  auVar31 = vfmadd231ps_fma(auVar54,auVar33,auVar31);
  auVar32 = vfmadd231ps_fma(auVar48,auVar33,auVar42);
  auVar42 = vfmadd231ps_fma(auVar47,auVar33,auVar238);
  auVar38 = vfmadd231ps_fma(auVar31,auVar220,auVar30);
  auVar238 = vfmadd231ps_fma(auVar32,auVar220,auVar41);
  auVar34 = vfmadd231ps_fma(auVar42,auVar220,auVar43);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar30);
  auVar31 = vandps_avx512vl(auVar37,auVar30);
  auVar149._8_4_ = 0x219392ef;
  auVar149._0_8_ = 0x219392ef219392ef;
  auVar149._12_4_ = 0x219392ef;
  uVar25 = vcmpps_avx512vl(auVar31,auVar149,1);
  bVar10 = (bool)((byte)uVar25 & 1);
  auVar35._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar37._0_4_;
  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
  auVar35._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar37._4_4_;
  bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
  auVar35._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar37._8_4_;
  bVar10 = (bool)((byte)(uVar25 >> 3) & 1);
  auVar35._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar37._12_4_;
  auVar31 = vandps_avx512vl(auVar36,auVar30);
  uVar25 = vcmpps_avx512vl(auVar31,auVar149,1);
  bVar10 = (bool)((byte)uVar25 & 1);
  auVar37._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar36._0_4_;
  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
  auVar37._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar36._4_4_;
  bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
  auVar37._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar36._8_4_;
  bVar10 = (bool)((byte)(uVar25 >> 3) & 1);
  auVar37._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar36._12_4_;
  auVar30 = vandps_avx512vl(auVar39,auVar30);
  uVar25 = vcmpps_avx512vl(auVar30,auVar149,1);
  bVar10 = (bool)((byte)uVar25 & 1);
  auVar36._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._0_4_;
  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._4_4_;
  bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._8_4_;
  bVar10 = (bool)((byte)(uVar25 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._12_4_;
  auVar30 = vrcp14ps_avx512vl(auVar35);
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar239 = ZEXT1664(auVar31);
  auVar32 = vfnmadd213ps_avx512vl(auVar35,auVar30,auVar31);
  auVar41 = vfmadd132ps_fma(auVar32,auVar30,auVar30);
  auVar30 = vrcp14ps_avx512vl(auVar37);
  auVar32 = vfnmadd213ps_avx512vl(auVar37,auVar30,auVar31);
  auVar42 = vfmadd132ps_fma(auVar32,auVar30,auVar30);
  auVar32 = vrcp14ps_avx512vl(auVar36);
  auVar31 = vfnmadd213ps_avx512vl(auVar36,auVar32,auVar31);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar20 * 7 + 6);
  auVar30 = vpmovsxwd_avx(auVar30);
  auVar43 = vfmadd132ps_fma(auVar31,auVar32,auVar32);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar32 = vsubps_avx(auVar30,auVar38);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar20 * 9 + 6);
  auVar30 = vpmovsxwd_avx(auVar31);
  auVar45._0_4_ = auVar41._0_4_ * auVar32._0_4_;
  auVar45._4_4_ = auVar41._4_4_ * auVar32._4_4_;
  auVar45._8_4_ = auVar41._8_4_ * auVar32._8_4_;
  auVar45._12_4_ = auVar41._12_4_ * auVar32._12_4_;
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vsubps_avx(auVar30,auVar38);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar20 * 0xe + 6);
  auVar30 = vpmovsxwd_avx(auVar32);
  auVar44._0_4_ = auVar41._0_4_ * auVar31._0_4_;
  auVar44._4_4_ = auVar41._4_4_ * auVar31._4_4_;
  auVar44._8_4_ = auVar41._8_4_ * auVar31._8_4_;
  auVar44._12_4_ = auVar41._12_4_ * auVar31._12_4_;
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar238);
  auVar52._0_4_ = auVar42._0_4_ * auVar30._0_4_;
  auVar52._4_4_ = auVar42._4_4_ * auVar30._4_4_;
  auVar52._8_4_ = auVar42._8_4_ * auVar30._8_4_;
  auVar52._12_4_ = auVar42._12_4_ * auVar30._12_4_;
  auVar32 = vpbroadcastd_avx512vl();
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar30 = vpmovsxwd_avx(auVar41);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar238);
  auVar46._0_4_ = auVar42._0_4_ * auVar30._0_4_;
  auVar46._4_4_ = auVar42._4_4_ * auVar30._4_4_;
  auVar46._8_4_ = auVar42._8_4_ * auVar30._8_4_;
  auVar46._12_4_ = auVar42._12_4_ * auVar30._12_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar20 * 0x15 + 6);
  auVar30 = vpmovsxwd_avx(auVar42);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar34);
  auVar49._0_4_ = auVar43._0_4_ * auVar30._0_4_;
  auVar49._4_4_ = auVar43._4_4_ * auVar30._4_4_;
  auVar49._8_4_ = auVar43._8_4_ * auVar30._8_4_;
  auVar49._12_4_ = auVar43._12_4_ * auVar30._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar20 * 0x17 + 6);
  auVar30 = vpmovsxwd_avx(auVar38);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar34);
  auVar51._0_4_ = auVar43._0_4_ * auVar30._0_4_;
  auVar51._4_4_ = auVar43._4_4_ * auVar30._4_4_;
  auVar51._8_4_ = auVar43._8_4_ * auVar30._8_4_;
  auVar51._12_4_ = auVar43._12_4_ * auVar30._12_4_;
  auVar30 = vpminsd_avx(auVar45,auVar44);
  auVar31 = vpminsd_avx(auVar52,auVar46);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar31 = vpminsd_avx(auVar49,auVar51);
  uVar92 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar43._4_4_ = uVar92;
  auVar43._0_4_ = uVar92;
  auVar43._8_4_ = uVar92;
  auVar43._12_4_ = uVar92;
  auVar31 = vmaxps_avx512vl(auVar31,auVar43);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar238._8_4_ = 0x3f7ffffa;
  auVar238._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar238._12_4_ = 0x3f7ffffa;
  local_5c0 = vmulps_avx512vl(auVar30,auVar238);
  auVar30 = vpmaxsd_avx(auVar45,auVar44);
  auVar31 = vpmaxsd_avx(auVar52,auVar46);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar31 = vpmaxsd_avx(auVar49,auVar51);
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar34._4_4_ = uVar92;
  auVar34._0_4_ = uVar92;
  auVar34._8_4_ = uVar92;
  auVar34._12_4_ = uVar92;
  auVar31 = vminps_avx512vl(auVar31,auVar34);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar33._8_4_ = 0x3f800003;
  auVar33._0_8_ = 0x3f8000033f800003;
  auVar33._12_4_ = 0x3f800003;
  auVar30 = vmulps_avx512vl(auVar30,auVar33);
  uVar11 = vcmpps_avx512vl(local_5c0,auVar30,2);
  uVar12 = vpcmpgtd_avx512vl(auVar32,_DAT_01f4ad30);
  uVar25 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar11 & 0xf & (byte)uVar12));
  auVar101 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar101);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar101 = ZEXT1664(auVar30);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar233 = ZEXT1664(auVar30);
  auVar241 = ZEXT464(0x3f800000);
LAB_017e5468:
  if (uVar25 == 0) {
LAB_017e6f7e:
    return uVar25 != 0;
  }
  lVar22 = 0;
  for (uVar20 = uVar25; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar20 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(prim + lVar22 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar30 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar20);
  lVar22 = uVar20 + 1;
  auVar31 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar22);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar32 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar20);
  auVar41 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar22);
  auVar77 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar77);
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar34 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar20),
                       auVar30,auVar33);
  auVar35 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar22),
                       auVar31,auVar33);
  auVar36 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar20 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar32,auVar33);
  auVar37 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar22),
                       auVar41,auVar33);
  auVar51 = ZEXT816(0) << 0x40;
  auVar156._0_4_ = auVar31._0_4_ * 0.0;
  auVar156._4_4_ = auVar31._4_4_ * 0.0;
  auVar156._8_4_ = auVar31._8_4_ * 0.0;
  auVar156._12_4_ = auVar31._12_4_ * 0.0;
  auVar43 = vfmadd231ps_fma(auVar156,auVar35,auVar51);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar34,auVar43);
  auVar165._0_4_ = auVar38._0_4_ + auVar30._0_4_;
  auVar165._4_4_ = auVar38._4_4_ + auVar30._4_4_;
  auVar165._8_4_ = auVar38._8_4_ + auVar30._8_4_;
  auVar165._12_4_ = auVar38._12_4_ + auVar30._12_4_;
  auVar53 = auVar101._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar43,auVar34,auVar53);
  auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar30,auVar53);
  auVar209._0_4_ = auVar41._0_4_ * 0.0;
  auVar209._4_4_ = auVar41._4_4_ * 0.0;
  auVar209._8_4_ = auVar41._8_4_ * 0.0;
  auVar209._12_4_ = auVar41._12_4_ * 0.0;
  auVar43 = vfmadd231ps_fma(auVar209,auVar37,auVar51);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar36,auVar43);
  auVar221._0_4_ = auVar38._0_4_ + auVar32._0_4_;
  auVar221._4_4_ = auVar38._4_4_ + auVar32._4_4_;
  auVar221._8_4_ = auVar38._8_4_ + auVar32._8_4_;
  auVar221._12_4_ = auVar38._12_4_ + auVar32._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar43,auVar36,auVar53);
  auVar40 = vfnmadd231ps_avx512vl(auVar38,auVar32,auVar53);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar35,auVar31);
  auVar38 = vfmadd231ps_fma(auVar38,auVar34,auVar51);
  auVar238 = vfmadd231ps_fma(auVar38,auVar30,auVar51);
  auVar31 = vmulps_avx512vl(auVar31,auVar53);
  auVar31 = vfnmadd231ps_avx512vl(auVar31,auVar53,auVar35);
  auVar31 = vfmadd231ps_fma(auVar31,auVar51,auVar34);
  auVar34 = vfnmadd231ps_fma(auVar31,auVar51,auVar30);
  auVar30 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar37,auVar41);
  auVar30 = vfmadd231ps_fma(auVar30,auVar36,auVar51);
  auVar38 = vfmadd231ps_fma(auVar30,auVar32,auVar51);
  auVar30 = vmulps_avx512vl(auVar41,auVar53);
  auVar30 = vfnmadd231ps_avx512vl(auVar30,auVar53,auVar37);
  auVar30 = vfmadd231ps_fma(auVar30,auVar51,auVar36);
  auVar43 = vfnmadd231ps_fma(auVar30,auVar51,auVar32);
  auVar30 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar31 = vshufps_avx(auVar221,auVar221,0xc9);
  fVar155 = auVar39._0_4_;
  auVar128._0_4_ = fVar155 * auVar31._0_4_;
  fVar163 = auVar39._4_4_;
  auVar128._4_4_ = fVar163 * auVar31._4_4_;
  fVar164 = auVar39._8_4_;
  auVar128._8_4_ = fVar164 * auVar31._8_4_;
  fVar206 = auVar39._12_4_;
  auVar128._12_4_ = fVar206 * auVar31._12_4_;
  auVar31 = vfmsub231ps_fma(auVar128,auVar30,auVar221);
  auVar32 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar137._0_4_ = fVar155 * auVar31._0_4_;
  auVar137._4_4_ = fVar163 * auVar31._4_4_;
  auVar137._8_4_ = fVar164 * auVar31._8_4_;
  auVar137._12_4_ = fVar206 * auVar31._12_4_;
  auVar30 = vfmsub231ps_fma(auVar137,auVar30,auVar40);
  auVar41 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar31 = vshufps_avx(auVar38,auVar38,0xc9);
  fVar91 = auVar34._0_4_;
  auVar183._0_4_ = auVar31._0_4_ * fVar91;
  fVar207 = auVar34._4_4_;
  auVar183._4_4_ = auVar31._4_4_ * fVar207;
  fVar191 = auVar34._8_4_;
  auVar183._8_4_ = auVar31._8_4_ * fVar191;
  fVar202 = auVar34._12_4_;
  auVar183._12_4_ = auVar31._12_4_ * fVar202;
  auVar31 = vfmsub231ps_fma(auVar183,auVar30,auVar38);
  auVar38 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar184._0_4_ = auVar31._0_4_ * fVar91;
  auVar184._4_4_ = auVar31._4_4_ * fVar207;
  auVar184._8_4_ = auVar31._8_4_ * fVar191;
  auVar184._12_4_ = auVar31._12_4_ * fVar202;
  auVar30 = vfmsub231ps_fma(auVar184,auVar30,auVar43);
  auVar43 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vdpps_avx(auVar32,auVar32,0x7f);
  fVar204 = auVar30._0_4_;
  auVar185._4_12_ = ZEXT812(0) << 0x20;
  auVar185._0_4_ = fVar204;
  auVar31 = vrsqrt14ss_avx512f(auVar51,auVar185);
  auVar35 = vmulss_avx512f(auVar31,ZEXT416(0x3fc00000));
  auVar36 = vmulss_avx512f(auVar30,ZEXT416(0x3f000000));
  fVar126 = auVar31._0_4_;
  fVar136 = auVar35._0_4_ - auVar36._0_4_ * fVar126 * fVar126 * fVar126;
  fVar208 = fVar136 * auVar32._0_4_;
  fVar217 = fVar136 * auVar32._4_4_;
  fVar218 = fVar136 * auVar32._8_4_;
  fVar219 = fVar136 * auVar32._12_4_;
  auVar31 = vdpps_avx(auVar32,auVar41,0x7f);
  auVar138._0_4_ = fVar204 * auVar41._0_4_;
  auVar138._4_4_ = fVar204 * auVar41._4_4_;
  auVar138._8_4_ = fVar204 * auVar41._8_4_;
  auVar138._12_4_ = fVar204 * auVar41._12_4_;
  fVar204 = auVar31._0_4_;
  auVar129._0_4_ = fVar204 * auVar32._0_4_;
  auVar129._4_4_ = fVar204 * auVar32._4_4_;
  auVar129._8_4_ = fVar204 * auVar32._8_4_;
  auVar129._12_4_ = fVar204 * auVar32._12_4_;
  auVar32 = vsubps_avx(auVar138,auVar129);
  auVar31 = vrcp14ss_avx512f(auVar51,auVar185);
  auVar30 = vfnmadd213ss_avx512f(auVar30,auVar31,ZEXT416(0x40000000));
  fVar204 = auVar31._0_4_ * auVar30._0_4_;
  auVar30 = vdpps_avx(auVar38,auVar38,0x7f);
  fVar126 = auVar30._0_4_;
  auVar130._4_12_ = ZEXT812(0) << 0x20;
  auVar130._0_4_ = fVar126;
  auVar31 = vrsqrt14ss_avx512f(auVar51,auVar130);
  auVar41 = vmulss_avx512f(auVar31,ZEXT416(0x3fc00000));
  auVar35 = vmulss_avx512f(auVar30,ZEXT416(0x3f000000));
  fVar182 = auVar31._0_4_;
  fVar182 = auVar41._0_4_ - auVar35._0_4_ * fVar182 * fVar182 * fVar182;
  fVar190 = fVar182 * auVar38._0_4_;
  fVar201 = fVar182 * auVar38._4_4_;
  fVar203 = fVar182 * auVar38._8_4_;
  fVar205 = fVar182 * auVar38._12_4_;
  auVar31 = vdpps_avx(auVar38,auVar43,0x7f);
  auVar106._0_4_ = fVar126 * auVar43._0_4_;
  auVar106._4_4_ = fVar126 * auVar43._4_4_;
  auVar106._8_4_ = fVar126 * auVar43._8_4_;
  auVar106._12_4_ = fVar126 * auVar43._12_4_;
  fVar126 = auVar31._0_4_;
  auVar93._0_4_ = fVar126 * auVar38._0_4_;
  auVar93._4_4_ = fVar126 * auVar38._4_4_;
  auVar93._8_4_ = fVar126 * auVar38._8_4_;
  auVar93._12_4_ = fVar126 * auVar38._12_4_;
  auVar41 = vsubps_avx(auVar106,auVar93);
  auVar31 = vrcp14ss_avx512f(auVar51,auVar130);
  auVar30 = vfnmadd213ss_avx512f(auVar30,auVar31,ZEXT416(0x40000000));
  fVar126 = auVar31._0_4_ * auVar30._0_4_;
  auVar30 = vshufps_avx(auVar165,auVar165,0xff);
  auVar131._0_4_ = fVar208 * auVar30._0_4_;
  auVar131._4_4_ = fVar217 * auVar30._4_4_;
  auVar131._8_4_ = fVar218 * auVar30._8_4_;
  auVar131._12_4_ = fVar219 * auVar30._12_4_;
  local_540 = vsubps_avx(auVar165,auVar131);
  auVar31 = vshufps_avx(auVar39,auVar39,0xff);
  auVar107._0_4_ = fVar208 * auVar31._0_4_ + auVar30._0_4_ * fVar136 * auVar32._0_4_ * fVar204;
  auVar107._4_4_ = fVar217 * auVar31._4_4_ + auVar30._4_4_ * fVar136 * auVar32._4_4_ * fVar204;
  auVar107._8_4_ = fVar218 * auVar31._8_4_ + auVar30._8_4_ * fVar136 * auVar32._8_4_ * fVar204;
  auVar107._12_4_ = fVar219 * auVar31._12_4_ + auVar30._12_4_ * fVar136 * auVar32._12_4_ * fVar204;
  auVar32 = vsubps_avx(auVar39,auVar107);
  local_550._0_4_ = auVar165._0_4_ + auVar131._0_4_;
  local_550._4_4_ = auVar165._4_4_ + auVar131._4_4_;
  fStack_548 = auVar165._8_4_ + auVar131._8_4_;
  fStack_544 = auVar165._12_4_ + auVar131._12_4_;
  auVar108._0_4_ = fVar155 + auVar107._0_4_;
  auVar108._4_4_ = fVar163 + auVar107._4_4_;
  auVar108._8_4_ = fVar164 + auVar107._8_4_;
  auVar108._12_4_ = fVar206 + auVar107._12_4_;
  auVar30 = vshufps_avx(auVar238,auVar238,0xff);
  auVar139._0_4_ = fVar190 * auVar30._0_4_;
  auVar139._4_4_ = fVar201 * auVar30._4_4_;
  auVar139._8_4_ = fVar203 * auVar30._8_4_;
  auVar139._12_4_ = fVar205 * auVar30._12_4_;
  local_560 = vsubps_avx(auVar238,auVar139);
  auVar31 = vshufps_avx(auVar34,auVar34,0xff);
  auVar94._0_4_ = fVar190 * auVar31._0_4_ + auVar30._0_4_ * fVar182 * auVar41._0_4_ * fVar126;
  auVar94._4_4_ = fVar201 * auVar31._4_4_ + auVar30._4_4_ * fVar182 * auVar41._4_4_ * fVar126;
  auVar94._8_4_ = fVar203 * auVar31._8_4_ + auVar30._8_4_ * fVar182 * auVar41._8_4_ * fVar126;
  auVar94._12_4_ = fVar205 * auVar31._12_4_ + auVar30._12_4_ * fVar182 * auVar41._12_4_ * fVar126;
  auVar30 = vsubps_avx(auVar34,auVar94);
  _local_570 = vaddps_avx512vl(auVar238,auVar139);
  auVar95._0_4_ = fVar91 + auVar94._0_4_;
  auVar95._4_4_ = fVar207 + auVar94._4_4_;
  auVar95._8_4_ = fVar191 + auVar94._8_4_;
  auVar95._12_4_ = fVar202 + auVar94._12_4_;
  auVar31 = vmulps_avx512vl(auVar32,auVar33);
  local_580 = vaddps_avx512vl(local_540,auVar31);
  auVar30 = vmulps_avx512vl(auVar30,auVar33);
  local_590 = vsubps_avx512vl(local_560,auVar30);
  auVar30 = vmulps_avx512vl(auVar108,auVar33);
  _local_5a0 = vaddps_avx512vl(_local_550,auVar30);
  auVar30 = vmulps_avx512vl(auVar95,auVar33);
  _local_5b0 = vsubps_avx512vl(_local_570,auVar30);
  local_4c0 = vsubps_avx(local_540,auVar42);
  uVar92 = local_4c0._0_4_;
  auVar102._4_4_ = uVar92;
  auVar102._0_4_ = uVar92;
  auVar102._8_4_ = uVar92;
  auVar102._12_4_ = uVar92;
  auVar30 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar31 = vshufps_avx(local_4c0,local_4c0,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar91 = pre->ray_space[k].vz.field_0.m128[0];
  fVar207 = pre->ray_space[k].vz.field_0.m128[1];
  fVar191 = pre->ray_space[k].vz.field_0.m128[2];
  fVar202 = pre->ray_space[k].vz.field_0.m128[3];
  auVar96._0_4_ = fVar91 * auVar31._0_4_;
  auVar96._4_4_ = fVar207 * auVar31._4_4_;
  auVar96._8_4_ = fVar191 * auVar31._8_4_;
  auVar96._12_4_ = fVar202 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar3,auVar30);
  auVar43 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar102);
  local_4d0 = vsubps_avx512vl(local_580,auVar42);
  uVar92 = local_4d0._0_4_;
  auVar109._4_4_ = uVar92;
  auVar109._0_4_ = uVar92;
  auVar109._8_4_ = uVar92;
  auVar109._12_4_ = uVar92;
  auVar30 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar31 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar103._0_4_ = fVar91 * auVar31._0_4_;
  auVar103._4_4_ = fVar207 * auVar31._4_4_;
  auVar103._8_4_ = fVar191 * auVar31._8_4_;
  auVar103._12_4_ = fVar202 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar3,auVar30);
  auVar238 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar109);
  local_4e0 = vsubps_avx512vl(local_590,auVar42);
  uVar92 = local_4e0._0_4_;
  auVar110._4_4_ = uVar92;
  auVar110._0_4_ = uVar92;
  auVar110._8_4_ = uVar92;
  auVar110._12_4_ = uVar92;
  auVar30 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar31 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar166._0_4_ = auVar31._0_4_ * fVar91;
  auVar166._4_4_ = auVar31._4_4_ * fVar207;
  auVar166._8_4_ = auVar31._8_4_ * fVar191;
  auVar166._12_4_ = auVar31._12_4_ * fVar202;
  auVar30 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar3,auVar30);
  auVar34 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar110);
  local_4f0 = vsubps_avx(local_560,auVar42);
  uVar92 = local_4f0._0_4_;
  auVar111._4_4_ = uVar92;
  auVar111._0_4_ = uVar92;
  auVar111._8_4_ = uVar92;
  auVar111._12_4_ = uVar92;
  auVar30 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar31 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar172._0_4_ = auVar31._0_4_ * fVar91;
  auVar172._4_4_ = auVar31._4_4_ * fVar207;
  auVar172._8_4_ = auVar31._8_4_ * fVar191;
  auVar172._12_4_ = auVar31._12_4_ * fVar202;
  auVar30 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar3,auVar30);
  auVar33 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar111);
  local_500 = vsubps_avx(_local_550,auVar42);
  uVar92 = local_500._0_4_;
  auVar112._4_4_ = uVar92;
  auVar112._0_4_ = uVar92;
  auVar112._8_4_ = uVar92;
  auVar112._12_4_ = uVar92;
  auVar30 = vshufps_avx(local_500,local_500,0x55);
  auVar31 = vshufps_avx(local_500,local_500,0xaa);
  auVar186._0_4_ = auVar31._0_4_ * fVar91;
  auVar186._4_4_ = auVar31._4_4_ * fVar207;
  auVar186._8_4_ = auVar31._8_4_ * fVar191;
  auVar186._12_4_ = auVar31._12_4_ * fVar202;
  auVar30 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar3,auVar30);
  auVar35 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar112);
  local_510 = vsubps_avx512vl(_local_5a0,auVar42);
  uVar92 = local_510._0_4_;
  auVar113._4_4_ = uVar92;
  auVar113._0_4_ = uVar92;
  auVar113._8_4_ = uVar92;
  auVar113._12_4_ = uVar92;
  auVar30 = vshufps_avx(local_510,local_510,0x55);
  auVar31 = vshufps_avx(local_510,local_510,0xaa);
  auVar192._0_4_ = auVar31._0_4_ * fVar91;
  auVar192._4_4_ = auVar31._4_4_ * fVar207;
  auVar192._8_4_ = auVar31._8_4_ * fVar191;
  auVar192._12_4_ = auVar31._12_4_ * fVar202;
  auVar30 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar30);
  auVar36 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar113);
  local_520 = vsubps_avx512vl(_local_5b0,auVar42);
  uVar92 = local_520._0_4_;
  auVar114._4_4_ = uVar92;
  auVar114._0_4_ = uVar92;
  auVar114._8_4_ = uVar92;
  auVar114._12_4_ = uVar92;
  auVar30 = vshufps_avx(local_520,local_520,0x55);
  auVar31 = vshufps_avx(local_520,local_520,0xaa);
  auVar210._0_4_ = auVar31._0_4_ * fVar91;
  auVar210._4_4_ = auVar31._4_4_ * fVar207;
  auVar210._8_4_ = auVar31._8_4_ * fVar191;
  auVar210._12_4_ = auVar31._12_4_ * fVar202;
  auVar30 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar3,auVar30);
  auVar37 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar114);
  local_530 = vsubps_avx512vl(_local_570,auVar42);
  uVar92 = local_530._0_4_;
  auVar115._4_4_ = uVar92;
  auVar115._0_4_ = uVar92;
  auVar115._8_4_ = uVar92;
  auVar115._12_4_ = uVar92;
  auVar30 = vshufps_avx(local_530,local_530,0x55);
  auVar31 = vshufps_avx(local_530,local_530,0xaa);
  auVar140._0_4_ = fVar91 * auVar31._0_4_;
  auVar140._4_4_ = fVar207 * auVar31._4_4_;
  auVar140._8_4_ = fVar191 * auVar31._8_4_;
  auVar140._12_4_ = fVar202 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar3,auVar30);
  auVar39 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar115);
  auVar32 = vmovlhps_avx(auVar43,auVar35);
  auVar41 = vmovlhps_avx(auVar238,auVar36);
  auVar38 = vmovlhps_avx512f(auVar34,auVar37);
  _local_4a0 = vmovlhps_avx512f(auVar33,auVar39);
  auVar31 = vminps_avx(auVar32,auVar41);
  auVar30 = vmaxps_avx(auVar32,auVar41);
  auVar42 = vminps_avx512vl(auVar38,_local_4a0);
  auVar31 = vminps_avx(auVar31,auVar42);
  auVar42 = vmaxps_avx512vl(auVar38,_local_4a0);
  auVar30 = vmaxps_avx(auVar30,auVar42);
  auVar42 = vshufpd_avx(auVar31,auVar31,3);
  auVar31 = vminps_avx(auVar31,auVar42);
  auVar42 = vshufpd_avx(auVar30,auVar30,3);
  auVar30 = vmaxps_avx(auVar30,auVar42);
  auVar31 = vandps_avx512vl(auVar31,auVar237._0_16_);
  auVar30 = vandps_avx512vl(auVar30,auVar237._0_16_);
  auVar30 = vmaxps_avx(auVar31,auVar30);
  auVar31 = vmovshdup_avx(auVar30);
  auVar30 = vmaxss_avx(auVar31,auVar30);
  auVar31 = vmovddup_avx512vl(auVar43);
  auVar42 = vmovddup_avx512vl(auVar238);
  auVar167._0_8_ = auVar34._0_8_;
  auVar167._8_8_ = auVar167._0_8_;
  auVar173._0_8_ = auVar33._0_8_;
  auVar173._8_8_ = auVar173._0_8_;
  local_4b0 = ZEXT416((uint)(auVar30._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4b0);
  auVar30 = vxorps_avx512vl(local_440._0_16_,auVar233._0_16_);
  local_460 = vbroadcastss_avx512vl(auVar30);
  bVar10 = false;
  uVar20 = 0;
  fVar91 = *(float *)(ray + k * 4 + 0xc0);
  local_470 = vsubps_avx(auVar41,auVar32);
  local_480 = vsubps_avx512vl(auVar38,auVar41);
  local_490 = vsubps_avx512vl(_local_4a0,auVar38);
  local_5d0 = vsubps_avx(_local_550,local_540);
  local_5e0 = vsubps_avx512vl(_local_5a0,local_580);
  local_5f0 = vsubps_avx512vl(_local_5b0,local_590);
  _local_600 = vsubps_avx512vl(_local_570,local_560);
  auVar101 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar101);
  auVar30 = ZEXT816(0x3f80000000000000);
  auVar77._32_32_ = auVar101._32_32_;
  auVar104 = auVar30;
LAB_017e5b6f:
  auVar242 = ZEXT3264(local_460);
  auVar240 = ZEXT3264(local_440);
  auVar43 = vshufps_avx(auVar104,auVar104,0x50);
  auVar225._8_4_ = 0x3f800000;
  auVar225._0_8_ = 0x3f8000003f800000;
  auVar225._12_4_ = 0x3f800000;
  auVar76._16_4_ = 0x3f800000;
  auVar76._0_16_ = auVar225;
  auVar76._20_4_ = 0x3f800000;
  auVar76._24_4_ = 0x3f800000;
  auVar76._28_4_ = 0x3f800000;
  auVar238 = vsubps_avx(auVar225,auVar43);
  fVar207 = auVar43._0_4_;
  fVar126 = auVar35._0_4_;
  auVar132._0_4_ = fVar126 * fVar207;
  fVar191 = auVar43._4_4_;
  fVar136 = auVar35._4_4_;
  auVar132._4_4_ = fVar136 * fVar191;
  fVar202 = auVar43._8_4_;
  auVar132._8_4_ = fVar126 * fVar202;
  fVar204 = auVar43._12_4_;
  auVar132._12_4_ = fVar136 * fVar204;
  fVar182 = auVar36._0_4_;
  auVar141._0_4_ = fVar182 * fVar207;
  fVar155 = auVar36._4_4_;
  auVar141._4_4_ = fVar155 * fVar191;
  auVar141._8_4_ = fVar182 * fVar202;
  auVar141._12_4_ = fVar155 * fVar204;
  fVar163 = auVar37._0_4_;
  auVar150._0_4_ = fVar163 * fVar207;
  fVar164 = auVar37._4_4_;
  auVar150._4_4_ = fVar164 * fVar191;
  auVar150._8_4_ = fVar163 * fVar202;
  auVar150._12_4_ = fVar164 * fVar204;
  fVar203 = auVar39._0_4_;
  auVar116._0_4_ = fVar203 * fVar207;
  fVar205 = auVar39._4_4_;
  auVar116._4_4_ = fVar205 * fVar191;
  auVar116._8_4_ = fVar203 * fVar202;
  auVar116._12_4_ = fVar205 * fVar204;
  auVar33 = vfmadd231ps_avx512vl(auVar132,auVar238,auVar31);
  auVar40 = vfmadd231ps_avx512vl(auVar141,auVar238,auVar42);
  auVar34 = vfmadd231ps_fma(auVar150,auVar238,auVar167);
  auVar238 = vfmadd231ps_fma(auVar116,auVar173,auVar238);
  auVar43 = vmovshdup_avx(auVar30);
  fVar191 = auVar30._0_4_;
  fVar207 = (auVar43._0_4_ - fVar191) * 0.04761905;
  auVar70._4_4_ = fVar191;
  auVar70._0_4_ = fVar191;
  auVar70._8_4_ = fVar191;
  auVar70._12_4_ = fVar191;
  auVar70._16_4_ = fVar191;
  auVar70._20_4_ = fVar191;
  auVar70._24_4_ = fVar191;
  auVar70._28_4_ = fVar191;
  auVar59._0_8_ = auVar43._0_8_;
  auVar59._8_8_ = auVar59._0_8_;
  auVar59._16_8_ = auVar59._0_8_;
  auVar59._24_8_ = auVar59._0_8_;
  auVar73 = vsubps_avx(auVar59,auVar70);
  uVar92 = auVar33._0_4_;
  auVar74._4_4_ = uVar92;
  auVar74._0_4_ = uVar92;
  auVar74._8_4_ = uVar92;
  auVar74._12_4_ = uVar92;
  auVar74._16_4_ = uVar92;
  auVar74._20_4_ = uVar92;
  auVar74._24_4_ = uVar92;
  auVar74._28_4_ = uVar92;
  auVar62._8_4_ = 1;
  auVar62._0_8_ = 0x100000001;
  auVar62._12_4_ = 1;
  auVar62._16_4_ = 1;
  auVar62._20_4_ = 1;
  auVar62._24_4_ = 1;
  auVar62._28_4_ = 1;
  auVar72 = ZEXT1632(auVar33);
  auVar71 = vpermps_avx2(auVar62,auVar72);
  auVar56 = vbroadcastss_avx512vl(auVar40);
  auVar66 = ZEXT1632(auVar40);
  auVar57 = vpermps_avx512vl(auVar62,auVar66);
  auVar58 = vbroadcastss_avx512vl(auVar34);
  auVar67 = ZEXT1632(auVar34);
  auVar59 = vpermps_avx512vl(auVar62,auVar67);
  auVar60 = vbroadcastss_avx512vl(auVar238);
  auVar69 = ZEXT1632(auVar238);
  auVar61 = vpermps_avx512vl(auVar62,auVar69);
  auVar75._4_4_ = fVar207;
  auVar75._0_4_ = fVar207;
  auVar75._8_4_ = fVar207;
  auVar75._12_4_ = fVar207;
  auVar75._16_4_ = fVar207;
  auVar75._20_4_ = fVar207;
  auVar75._24_4_ = fVar207;
  auVar75._28_4_ = fVar207;
  auVar68._8_4_ = 2;
  auVar68._0_8_ = 0x200000002;
  auVar68._12_4_ = 2;
  auVar68._16_4_ = 2;
  auVar68._20_4_ = 2;
  auVar68._24_4_ = 2;
  auVar68._28_4_ = 2;
  auVar62 = vpermps_avx512vl(auVar68,auVar72);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar64 = vpermps_avx512vl(auVar63,auVar72);
  auVar65 = vpermps_avx512vl(auVar68,auVar66);
  auVar66 = vpermps_avx512vl(auVar63,auVar66);
  auVar72 = vpermps_avx2(auVar68,auVar67);
  auVar67 = vpermps_avx512vl(auVar63,auVar67);
  auVar68 = vpermps_avx512vl(auVar68,auVar69);
  auVar63 = vpermps_avx512vl(auVar63,auVar69);
  auVar43 = vfmadd132ps_fma(auVar73,auVar70,_DAT_01f7b040);
  auVar73 = vsubps_avx(auVar76,ZEXT1632(auVar43));
  auVar69 = vmulps_avx512vl(auVar56,ZEXT1632(auVar43));
  auVar76 = ZEXT1632(auVar43);
  auVar70 = vmulps_avx512vl(auVar57,auVar76);
  auVar238 = vfmadd231ps_fma(auVar69,auVar73,auVar74);
  auVar34 = vfmadd231ps_fma(auVar70,auVar73,auVar71);
  auVar69 = vmulps_avx512vl(auVar58,auVar76);
  auVar70 = vmulps_avx512vl(auVar59,auVar76);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar73,auVar56);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar73,auVar57);
  auVar56 = vmulps_avx512vl(auVar60,auVar76);
  auVar74 = ZEXT1632(auVar43);
  auVar57 = vmulps_avx512vl(auVar61,auVar74);
  auVar58 = vfmadd231ps_avx512vl(auVar56,auVar73,auVar58);
  auVar59 = vfmadd231ps_avx512vl(auVar57,auVar73,auVar59);
  fVar202 = auVar43._0_4_;
  fVar204 = auVar43._4_4_;
  auVar56._4_4_ = fVar204 * auVar69._4_4_;
  auVar56._0_4_ = fVar202 * auVar69._0_4_;
  fVar206 = auVar43._8_4_;
  auVar56._8_4_ = fVar206 * auVar69._8_4_;
  fVar190 = auVar43._12_4_;
  auVar56._12_4_ = fVar190 * auVar69._12_4_;
  auVar56._16_4_ = auVar69._16_4_ * 0.0;
  auVar56._20_4_ = auVar69._20_4_ * 0.0;
  auVar56._24_4_ = auVar69._24_4_ * 0.0;
  auVar56._28_4_ = fVar191;
  auVar57._4_4_ = fVar204 * auVar70._4_4_;
  auVar57._0_4_ = fVar202 * auVar70._0_4_;
  auVar57._8_4_ = fVar206 * auVar70._8_4_;
  auVar57._12_4_ = fVar190 * auVar70._12_4_;
  auVar57._16_4_ = auVar70._16_4_ * 0.0;
  auVar57._20_4_ = auVar70._20_4_ * 0.0;
  auVar57._24_4_ = auVar70._24_4_ * 0.0;
  auVar57._28_4_ = auVar71._28_4_;
  auVar238 = vfmadd231ps_fma(auVar56,auVar73,ZEXT1632(auVar238));
  auVar34 = vfmadd231ps_fma(auVar57,auVar73,ZEXT1632(auVar34));
  auVar61._0_4_ = fVar202 * auVar58._0_4_;
  auVar61._4_4_ = fVar204 * auVar58._4_4_;
  auVar61._8_4_ = fVar206 * auVar58._8_4_;
  auVar61._12_4_ = fVar190 * auVar58._12_4_;
  auVar61._16_4_ = auVar58._16_4_ * 0.0;
  auVar61._20_4_ = auVar58._20_4_ * 0.0;
  auVar61._24_4_ = auVar58._24_4_ * 0.0;
  auVar61._28_4_ = 0;
  auVar71._4_4_ = fVar204 * auVar59._4_4_;
  auVar71._0_4_ = fVar202 * auVar59._0_4_;
  auVar71._8_4_ = fVar206 * auVar59._8_4_;
  auVar71._12_4_ = fVar190 * auVar59._12_4_;
  auVar71._16_4_ = auVar59._16_4_ * 0.0;
  auVar71._20_4_ = auVar59._20_4_ * 0.0;
  auVar71._24_4_ = auVar59._24_4_ * 0.0;
  auVar71._28_4_ = auVar58._28_4_;
  auVar33 = vfmadd231ps_fma(auVar61,auVar73,auVar69);
  auVar40 = vfmadd231ps_fma(auVar71,auVar73,auVar70);
  auVar58._28_4_ = auVar70._28_4_;
  auVar58._0_28_ =
       ZEXT1628(CONCAT412(fVar190 * auVar40._12_4_,
                          CONCAT48(fVar206 * auVar40._8_4_,
                                   CONCAT44(fVar204 * auVar40._4_4_,fVar202 * auVar40._0_4_))));
  auVar51 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar190 * auVar33._12_4_,
                                               CONCAT48(fVar206 * auVar33._8_4_,
                                                        CONCAT44(fVar204 * auVar33._4_4_,
                                                                 fVar202 * auVar33._0_4_)))),auVar73
                            ,ZEXT1632(auVar238));
  auVar53 = vfmadd231ps_fma(auVar58,auVar73,ZEXT1632(auVar34));
  auVar71 = vsubps_avx(ZEXT1632(auVar33),ZEXT1632(auVar238));
  auVar56 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar34));
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar71 = vmulps_avx512vl(auVar71,auVar57);
  auVar56 = vmulps_avx512vl(auVar56,auVar57);
  auVar69._0_4_ = fVar207 * auVar71._0_4_;
  auVar69._4_4_ = fVar207 * auVar71._4_4_;
  auVar69._8_4_ = fVar207 * auVar71._8_4_;
  auVar69._12_4_ = fVar207 * auVar71._12_4_;
  auVar69._16_4_ = fVar207 * auVar71._16_4_;
  auVar69._20_4_ = fVar207 * auVar71._20_4_;
  auVar69._24_4_ = fVar207 * auVar71._24_4_;
  auVar69._28_4_ = 0;
  auVar71 = vmulps_avx512vl(auVar75,auVar56);
  auVar34 = vxorps_avx512vl(auVar60._0_16_,auVar60._0_16_);
  auVar56 = vpermt2ps_avx512vl(ZEXT1632(auVar51),_DAT_01fb9fc0,ZEXT1632(auVar34));
  auVar58 = vpermt2ps_avx512vl(ZEXT1632(auVar53),_DAT_01fb9fc0,ZEXT1632(auVar34));
  auVar121._0_4_ = auVar69._0_4_ + auVar51._0_4_;
  auVar121._4_4_ = auVar69._4_4_ + auVar51._4_4_;
  auVar121._8_4_ = auVar69._8_4_ + auVar51._8_4_;
  auVar121._12_4_ = auVar69._12_4_ + auVar51._12_4_;
  auVar121._16_4_ = auVar69._16_4_ + 0.0;
  auVar121._20_4_ = auVar69._20_4_ + 0.0;
  auVar121._24_4_ = auVar69._24_4_ + 0.0;
  auVar121._28_4_ = 0;
  auVar70 = ZEXT1632(auVar34);
  auVar59 = vpermt2ps_avx512vl(auVar69,_DAT_01fb9fc0,auVar70);
  auVar60 = vaddps_avx512vl(ZEXT1632(auVar53),auVar71);
  auVar61 = vpermt2ps_avx512vl(auVar71,_DAT_01fb9fc0,auVar70);
  auVar71 = vsubps_avx(auVar56,auVar59);
  auVar59 = vsubps_avx512vl(auVar58,auVar61);
  auVar61 = vmulps_avx512vl(auVar65,auVar74);
  auVar69 = vmulps_avx512vl(auVar66,auVar74);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar73,auVar62);
  auVar62 = vfmadd231ps_avx512vl(auVar69,auVar73,auVar64);
  auVar64 = vmulps_avx512vl(auVar72,auVar74);
  auVar69 = vmulps_avx512vl(auVar67,auVar74);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar73,auVar65);
  auVar65 = vfmadd231ps_avx512vl(auVar69,auVar73,auVar66);
  auVar66 = vmulps_avx512vl(auVar68,auVar74);
  auVar63 = vmulps_avx512vl(auVar63,auVar74);
  auVar238 = vfmadd231ps_fma(auVar66,auVar73,auVar72);
  auVar72 = vfmadd231ps_avx512vl(auVar63,auVar73,auVar67);
  auVar63 = vmulps_avx512vl(auVar74,auVar64);
  auVar68 = ZEXT1632(auVar43);
  auVar66 = vmulps_avx512vl(auVar68,auVar65);
  auVar61 = vfmadd231ps_avx512vl(auVar63,auVar73,auVar61);
  auVar62 = vfmadd231ps_avx512vl(auVar66,auVar73,auVar62);
  auVar72 = vmulps_avx512vl(auVar68,auVar72);
  auVar63 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar190 * auVar238._12_4_,
                                          CONCAT48(fVar206 * auVar238._8_4_,
                                                   CONCAT44(fVar204 * auVar238._4_4_,
                                                            fVar202 * auVar238._0_4_)))),auVar73,
                       auVar64);
  auVar64 = vfmadd231ps_avx512vl(auVar72,auVar73,auVar65);
  auVar72._4_4_ = fVar204 * auVar63._4_4_;
  auVar72._0_4_ = fVar202 * auVar63._0_4_;
  auVar72._8_4_ = fVar206 * auVar63._8_4_;
  auVar72._12_4_ = fVar190 * auVar63._12_4_;
  auVar72._16_4_ = auVar63._16_4_ * 0.0;
  auVar72._20_4_ = auVar63._20_4_ * 0.0;
  auVar72._24_4_ = auVar63._24_4_ * 0.0;
  auVar72._28_4_ = auVar67._28_4_;
  auVar65 = vmulps_avx512vl(auVar68,auVar64);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar73,auVar61);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar62,auVar73);
  auVar73 = vsubps_avx512vl(auVar63,auVar61);
  auVar61 = vsubps_avx512vl(auVar64,auVar62);
  auVar62 = vmulps_avx512vl(auVar73,auVar57);
  auVar57 = vmulps_avx512vl(auVar61,auVar57);
  fVar191 = fVar207 * auVar62._0_4_;
  fVar202 = fVar207 * auVar62._4_4_;
  auVar73._4_4_ = fVar202;
  auVar73._0_4_ = fVar191;
  fVar204 = fVar207 * auVar62._8_4_;
  auVar73._8_4_ = fVar204;
  fVar206 = fVar207 * auVar62._12_4_;
  auVar73._12_4_ = fVar206;
  fVar190 = fVar207 * auVar62._16_4_;
  auVar73._16_4_ = fVar190;
  fVar201 = fVar207 * auVar62._20_4_;
  auVar73._20_4_ = fVar201;
  fVar207 = fVar207 * auVar62._24_4_;
  auVar73._24_4_ = fVar207;
  auVar73._28_4_ = auVar62._28_4_;
  auVar57 = vmulps_avx512vl(auVar75,auVar57);
  auVar61 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,auVar70);
  auVar63 = vpermt2ps_avx512vl(auVar65,_DAT_01fb9fc0,auVar70);
  auVar189._0_4_ = auVar72._0_4_ + fVar191;
  auVar189._4_4_ = auVar72._4_4_ + fVar202;
  auVar189._8_4_ = auVar72._8_4_ + fVar204;
  auVar189._12_4_ = auVar72._12_4_ + fVar206;
  auVar189._16_4_ = auVar72._16_4_ + fVar190;
  auVar189._20_4_ = auVar72._20_4_ + fVar201;
  auVar189._24_4_ = auVar72._24_4_ + fVar207;
  auVar189._28_4_ = auVar72._28_4_ + auVar62._28_4_;
  auVar73 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,ZEXT1632(auVar34));
  auVar62 = vaddps_avx512vl(auVar65,auVar57);
  auVar57 = vpermt2ps_avx512vl(auVar57,_DAT_01fb9fc0,ZEXT1632(auVar34));
  auVar73 = vsubps_avx(auVar61,auVar73);
  auVar57 = vsubps_avx512vl(auVar63,auVar57);
  auVar135 = ZEXT1632(auVar51);
  auVar64 = vsubps_avx512vl(auVar72,auVar135);
  auVar148 = ZEXT1632(auVar53);
  auVar66 = vsubps_avx512vl(auVar65,auVar148);
  auVar67 = vsubps_avx512vl(auVar61,auVar56);
  auVar64 = vaddps_avx512vl(auVar64,auVar67);
  auVar67 = vsubps_avx512vl(auVar63,auVar58);
  auVar66 = vaddps_avx512vl(auVar66,auVar67);
  auVar67 = vmulps_avx512vl(auVar148,auVar64);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar135,auVar66);
  auVar68 = vmulps_avx512vl(auVar60,auVar64);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar121,auVar66);
  auVar69 = vmulps_avx512vl(auVar59,auVar64);
  auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar71,auVar66);
  auVar70 = vmulps_avx512vl(auVar58,auVar64);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar56,auVar66);
  auVar74 = vmulps_avx512vl(auVar65,auVar64);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar72,auVar66);
  auVar75 = vmulps_avx512vl(auVar62,auVar64);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar189,auVar66);
  auVar76 = vmulps_avx512vl(auVar57,auVar64);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar73,auVar66);
  auVar64 = vmulps_avx512vl(auVar63,auVar64);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar61,auVar66);
  auVar66 = vminps_avx512vl(auVar67,auVar68);
  auVar67 = vmaxps_avx512vl(auVar67,auVar68);
  auVar68 = vminps_avx512vl(auVar69,auVar70);
  auVar66 = vminps_avx512vl(auVar66,auVar68);
  auVar68 = vmaxps_avx512vl(auVar69,auVar70);
  auVar67 = vmaxps_avx512vl(auVar67,auVar68);
  auVar68 = vminps_avx512vl(auVar74,auVar75);
  auVar69 = vmaxps_avx512vl(auVar74,auVar75);
  auVar70 = vminps_avx512vl(auVar76,auVar64);
  auVar68 = vminps_avx512vl(auVar68,auVar70);
  auVar66 = vminps_avx512vl(auVar66,auVar68);
  auVar64 = vmaxps_avx512vl(auVar76,auVar64);
  auVar64 = vmaxps_avx512vl(auVar69,auVar64);
  auVar64 = vmaxps_avx512vl(auVar67,auVar64);
  uVar11 = vcmpps_avx512vl(auVar66,local_440,2);
  uVar12 = vcmpps_avx512vl(auVar64,local_460,5);
  bVar18 = (byte)uVar11 & (byte)uVar12 & 0x7f;
  if (bVar18 != 0) {
    auVar64 = vsubps_avx512vl(auVar56,auVar135);
    auVar66 = vsubps_avx512vl(auVar58,auVar148);
    auVar67 = vsubps_avx512vl(auVar61,auVar72);
    auVar64 = vaddps_avx512vl(auVar64,auVar67);
    auVar67 = vsubps_avx512vl(auVar63,auVar65);
    auVar66 = vaddps_avx512vl(auVar66,auVar67);
    auVar67 = vmulps_avx512vl(auVar148,auVar64);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar66,auVar135);
    auVar60 = vmulps_avx512vl(auVar60,auVar64);
    auVar60 = vfnmadd213ps_avx512vl(auVar121,auVar66,auVar60);
    auVar59 = vmulps_avx512vl(auVar59,auVar64);
    auVar59 = vfnmadd213ps_avx512vl(auVar71,auVar66,auVar59);
    auVar71 = vmulps_avx512vl(auVar58,auVar64);
    auVar58 = vfnmadd231ps_avx512vl(auVar71,auVar66,auVar56);
    auVar71 = vmulps_avx512vl(auVar65,auVar64);
    auVar65 = vfnmadd231ps_avx512vl(auVar71,auVar66,auVar72);
    auVar71 = vmulps_avx512vl(auVar62,auVar64);
    auVar62 = vfnmadd213ps_avx512vl(auVar189,auVar66,auVar71);
    auVar71 = vmulps_avx512vl(auVar57,auVar64);
    auVar68 = vfnmadd213ps_avx512vl(auVar73,auVar66,auVar71);
    auVar73 = vmulps_avx512vl(auVar63,auVar64);
    auVar61 = vfnmadd231ps_avx512vl(auVar73,auVar61,auVar66);
    auVar71 = vminps_avx(auVar67,auVar60);
    auVar73 = vmaxps_avx(auVar67,auVar60);
    auVar56 = vminps_avx(auVar59,auVar58);
    auVar56 = vminps_avx(auVar71,auVar56);
    auVar71 = vmaxps_avx(auVar59,auVar58);
    auVar73 = vmaxps_avx(auVar73,auVar71);
    auVar72 = vminps_avx(auVar65,auVar62);
    auVar71 = vmaxps_avx(auVar65,auVar62);
    auVar57 = vminps_avx(auVar68,auVar61);
    auVar72 = vminps_avx(auVar72,auVar57);
    auVar72 = vminps_avx(auVar56,auVar72);
    auVar56 = vmaxps_avx(auVar68,auVar61);
    auVar71 = vmaxps_avx(auVar71,auVar56);
    auVar73 = vmaxps_avx(auVar73,auVar71);
    uVar11 = vcmpps_avx512vl(auVar73,local_460,5);
    uVar12 = vcmpps_avx512vl(auVar72,local_440,2);
    bVar18 = bVar18 & (byte)uVar11 & (byte)uVar12;
    if (bVar18 != 0) {
      auStack_640[uVar20] = (uint)bVar18;
      uVar11 = vmovlps_avx(auVar30);
      (&uStack_420)[uVar20] = uVar11;
      uVar1 = vmovlps_avx(auVar104);
      auStack_3a0[uVar20] = uVar1;
      uVar20 = (ulong)((int)uVar20 + 1);
    }
  }
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar101 = ZEXT1664(auVar30);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar233 = ZEXT1664(auVar30);
  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar234 = ZEXT3264(auVar73);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar235 = ZEXT1664(auVar30);
  auVar90._32_32_ = auVar77._32_32_;
  auVar90._0_32_ = _DAT_01fb9fe0;
  auVar236 = ZEXT3264(_DAT_01fb9fe0);
LAB_017e6065:
  do {
    do {
      do {
        if ((int)uVar20 == 0) {
          if (bVar10) goto LAB_017e6f7e;
          uVar92 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar16._4_4_ = uVar92;
          auVar16._0_4_ = uVar92;
          auVar16._8_4_ = uVar92;
          auVar16._12_4_ = uVar92;
          uVar11 = vcmpps_avx512vl(local_5c0,auVar16,2);
          uVar25 = (ulong)((uint)uVar25 & (uint)uVar25 + 0xf & (uint)uVar11);
          goto LAB_017e5468;
        }
        uVar19 = (int)uVar20 - 1;
        uVar21 = (ulong)uVar19;
        uVar5 = auStack_640[uVar21];
        auVar104._8_8_ = 0;
        auVar104._0_8_ = auStack_3a0[uVar21];
        uVar1 = 0;
        for (uVar24 = (ulong)uVar5; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        uVar23 = uVar5 - 1 & uVar5;
        bVar28 = uVar23 == 0;
        auStack_640[uVar21] = uVar23;
        if (bVar28) {
          uVar20 = (ulong)uVar19;
        }
        auVar97._8_8_ = 0;
        auVar97._0_8_ = uVar1;
        auVar30 = vpunpcklqdq_avx(auVar97,ZEXT416((int)uVar1 + 1));
        auVar77._32_32_ = auVar90._32_32_;
        auVar30 = vcvtqq2ps_avx512vl(auVar30);
        auVar30 = vmulps_avx512vl(auVar30,auVar235._0_16_);
        uVar92 = *(undefined4 *)((long)&uStack_420 + uVar21 * 8 + 4);
        auVar13._4_4_ = uVar92;
        auVar13._0_4_ = uVar92;
        auVar13._8_4_ = uVar92;
        auVar13._12_4_ = uVar92;
        auVar43 = vmulps_avx512vl(auVar30,auVar13);
        auVar238 = auVar239._0_16_;
        auVar30 = vsubps_avx512vl(auVar238,auVar30);
        uVar92 = *(undefined4 *)(&uStack_420 + uVar21);
        auVar14._4_4_ = uVar92;
        auVar14._0_4_ = uVar92;
        auVar14._8_4_ = uVar92;
        auVar14._12_4_ = uVar92;
        auVar30 = vfmadd231ps_avx512vl(auVar43,auVar30,auVar14);
        auVar43 = vmovshdup_avx(auVar30);
        fVar207 = auVar43._0_4_ - auVar30._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar207));
        if (uVar5 == 0 || bVar28) goto LAB_017e5b6f;
        auVar43 = vshufps_avx(auVar104,auVar104,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar207));
        auVar40 = vsubps_avx512vl(auVar238,auVar43);
        fVar191 = auVar43._0_4_;
        auVar142._0_4_ = fVar191 * fVar126;
        fVar202 = auVar43._4_4_;
        auVar142._4_4_ = fVar202 * fVar136;
        fVar204 = auVar43._8_4_;
        auVar142._8_4_ = fVar204 * fVar126;
        fVar206 = auVar43._12_4_;
        auVar142._12_4_ = fVar206 * fVar136;
        auVar151._0_4_ = fVar191 * fVar182;
        auVar151._4_4_ = fVar202 * fVar155;
        auVar151._8_4_ = fVar204 * fVar182;
        auVar151._12_4_ = fVar206 * fVar155;
        auVar157._0_4_ = fVar191 * fVar163;
        auVar157._4_4_ = fVar202 * fVar164;
        auVar157._8_4_ = fVar204 * fVar163;
        auVar157._12_4_ = fVar206 * fVar164;
        auVar122._0_4_ = fVar191 * fVar203;
        auVar122._4_4_ = fVar202 * fVar205;
        auVar122._8_4_ = fVar204 * fVar203;
        auVar122._12_4_ = fVar206 * fVar205;
        auVar43 = vfmadd231ps_fma(auVar142,auVar40,auVar31);
        auVar34 = vfmadd231ps_fma(auVar151,auVar40,auVar42);
        auVar33 = vfmadd231ps_fma(auVar157,auVar40,auVar167);
        auVar40 = vfmadd231ps_fma(auVar122,auVar40,auVar173);
        auVar60._16_16_ = auVar43;
        auVar60._0_16_ = auVar43;
        auVar63._16_16_ = auVar34;
        auVar63._0_16_ = auVar34;
        auVar65._16_16_ = auVar33;
        auVar65._0_16_ = auVar33;
        auVar71 = vpermps_avx512vl(auVar236._0_32_,ZEXT1632(auVar30));
        auVar73 = vsubps_avx(auVar63,auVar60);
        auVar34 = vfmadd213ps_fma(auVar73,auVar71,auVar60);
        auVar73 = vsubps_avx(auVar65,auVar63);
        auVar51 = vfmadd213ps_fma(auVar73,auVar71,auVar63);
        auVar43 = vsubps_avx(auVar40,auVar33);
        auVar64._16_16_ = auVar43;
        auVar64._0_16_ = auVar43;
        auVar43 = vfmadd213ps_fma(auVar64,auVar71,auVar65);
        auVar73 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar34));
        auVar34 = vfmadd213ps_fma(auVar73,auVar71,ZEXT1632(auVar34));
        auVar73 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar51));
        auVar43 = vfmadd213ps_fma(auVar73,auVar71,ZEXT1632(auVar51));
        auVar73 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar34));
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar73,auVar71);
        auVar77._0_32_ = vmulps_avx512vl(auVar73,auVar234._0_32_);
        auVar90._16_48_ = auVar77._16_48_;
        auVar43 = vmulss_avx512f(ZEXT416((uint)fVar207),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar191 = auVar43._0_4_;
        auVar158._0_8_ =
             CONCAT44(auVar127._4_4_ + fVar191 * auVar77._4_4_,
                      auVar127._0_4_ + fVar191 * auVar77._0_4_);
        auVar158._8_4_ = auVar127._8_4_ + fVar191 * auVar77._8_4_;
        auVar158._12_4_ = auVar127._12_4_ + fVar191 * auVar77._12_4_;
        auVar143._0_4_ = fVar191 * auVar77._16_4_;
        auVar143._4_4_ = fVar191 * auVar77._20_4_;
        auVar143._8_4_ = fVar191 * auVar77._24_4_;
        auVar143._12_4_ = fVar191 * auVar77._28_4_;
        auVar50 = vsubps_avx((undefined1  [16])0x0,auVar143);
        auVar51 = vshufpd_avx(auVar127,auVar127,3);
        auVar53 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar43 = vsubps_avx(auVar51,auVar127);
        auVar34 = vsubps_avx(auVar53,(undefined1  [16])0x0);
        auVar174._0_4_ = auVar43._0_4_ + auVar34._0_4_;
        auVar174._4_4_ = auVar43._4_4_ + auVar34._4_4_;
        auVar174._8_4_ = auVar43._8_4_ + auVar34._8_4_;
        auVar174._12_4_ = auVar43._12_4_ + auVar34._12_4_;
        auVar43 = vshufps_avx(auVar127,auVar127,0xb1);
        auVar34 = vshufps_avx(auVar158,auVar158,0xb1);
        auVar33 = vshufps_avx(auVar50,auVar50,0xb1);
        auVar40 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar226._4_4_ = auVar174._0_4_;
        auVar226._0_4_ = auVar174._0_4_;
        auVar226._8_4_ = auVar174._0_4_;
        auVar226._12_4_ = auVar174._0_4_;
        auVar46 = vshufps_avx(auVar174,auVar174,0x55);
        fVar191 = auVar46._0_4_;
        auVar187._0_4_ = auVar43._0_4_ * fVar191;
        fVar202 = auVar46._4_4_;
        auVar187._4_4_ = auVar43._4_4_ * fVar202;
        fVar204 = auVar46._8_4_;
        auVar187._8_4_ = auVar43._8_4_ * fVar204;
        fVar206 = auVar46._12_4_;
        auVar187._12_4_ = auVar43._12_4_ * fVar206;
        auVar193._0_4_ = auVar34._0_4_ * fVar191;
        auVar193._4_4_ = auVar34._4_4_ * fVar202;
        auVar193._8_4_ = auVar34._8_4_ * fVar204;
        auVar193._12_4_ = auVar34._12_4_ * fVar206;
        auVar211._0_4_ = auVar33._0_4_ * fVar191;
        auVar211._4_4_ = auVar33._4_4_ * fVar202;
        auVar211._8_4_ = auVar33._8_4_ * fVar204;
        auVar211._12_4_ = auVar33._12_4_ * fVar206;
        auVar175._0_4_ = auVar40._0_4_ * fVar191;
        auVar175._4_4_ = auVar40._4_4_ * fVar202;
        auVar175._8_4_ = auVar40._8_4_ * fVar204;
        auVar175._12_4_ = auVar40._12_4_ * fVar206;
        auVar43 = vfmadd231ps_fma(auVar187,auVar226,auVar127);
        auVar34 = vfmadd231ps_fma(auVar193,auVar226,auVar158);
        auVar48 = vfmadd231ps_fma(auVar211,auVar226,auVar50);
        auVar49 = vfmadd231ps_fma(auVar175,(undefined1  [16])0x0,auVar226);
        auVar46 = vshufpd_avx(auVar43,auVar43,1);
        auVar47 = vshufpd_avx(auVar34,auVar34,1);
        auVar44 = vshufpd_avx512vl(auVar48,auVar48,1);
        auVar45 = vshufpd_avx512vl(auVar49,auVar49,1);
        auVar33 = vminss_avx(auVar43,auVar34);
        auVar43 = vmaxss_avx(auVar34,auVar43);
        auVar40 = vminss_avx(auVar48,auVar49);
        auVar34 = vmaxss_avx(auVar49,auVar48);
        auVar33 = vminss_avx(auVar33,auVar40);
        auVar43 = vmaxss_avx(auVar34,auVar43);
        auVar40 = vminss_avx(auVar46,auVar47);
        auVar34 = vmaxss_avx(auVar47,auVar46);
        auVar46 = vminss_avx512f(auVar44,auVar45);
        auVar47 = vmaxss_avx512f(auVar45,auVar44);
        auVar34 = vmaxss_avx(auVar47,auVar34);
        auVar90._0_16_ = vminss_avx512f(auVar40,auVar46);
        vucomiss_avx512f(auVar33);
        fVar202 = auVar34._0_4_;
        fVar191 = auVar43._0_4_;
        if (4 < (uint)uVar20) {
          bVar29 = fVar202 == -0.0001;
          bVar26 = NAN(fVar202);
          if (fVar202 <= -0.0001) goto LAB_017e6286;
          break;
        }
LAB_017e6286:
        auVar40 = vucomiss_avx512f(auVar90._0_16_);
        bVar29 = fVar202 <= -0.0001;
        bVar27 = -0.0001 < fVar191;
        bVar26 = bVar29;
        if (!bVar29) break;
        uVar11 = vcmpps_avx512vl(auVar33,auVar40,5);
        uVar12 = vcmpps_avx512vl(auVar90._0_16_,auVar40,5);
        bVar18 = (byte)uVar11 & (byte)uVar12;
        bVar17 = (bVar18 & 1) == 0;
        bVar29 = bVar27 && bVar17;
        bVar26 = bVar27 && (bVar18 & 1) == 0;
      } while (!bVar27 || !bVar17);
      auVar47 = vxorps_avx512vl(auVar240._0_16_,auVar240._0_16_);
      auVar240 = ZEXT1664(auVar47);
      vcmpss_avx512f(auVar33,auVar47,1);
      uVar11 = vcmpss_avx512f(auVar43,auVar47,1);
      bVar27 = (bool)((byte)uVar11 & 1);
      auVar79._16_48_ = auVar90._16_48_;
      auVar79._0_16_ = auVar241._0_16_;
      auVar78._4_60_ = auVar79._4_60_;
      auVar78._0_4_ = (float)((uint)bVar27 * -0x40800000 + (uint)!bVar27 * auVar241._0_4_);
      vucomiss_avx512f(auVar78._0_16_);
      bVar26 = (bool)(!bVar29 | bVar26);
      bVar27 = bVar26 == false;
      auVar81._16_48_ = auVar90._16_48_;
      auVar81._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar80._4_60_ = auVar81._4_60_;
      auVar80._0_4_ = (uint)bVar26 * auVar47._0_4_ + (uint)!bVar26 * 0x7f800000;
      auVar46 = auVar80._0_16_;
      auVar83._16_48_ = auVar90._16_48_;
      auVar83._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar82._4_60_ = auVar83._4_60_;
      auVar82._0_4_ = (uint)bVar26 * auVar47._0_4_ + (uint)!bVar26 * -0x800000;
      auVar40 = auVar82._0_16_;
      auVar48 = vxorps_avx512vl(auVar242._0_16_,auVar242._0_16_);
      auVar242 = ZEXT1664(auVar48);
      uVar11 = vcmpss_avx512f(auVar90._0_16_,auVar47,1);
      bVar29 = (bool)((byte)uVar11 & 1);
      auVar85._16_48_ = auVar90._16_48_;
      auVar85._0_16_ = auVar241._0_16_;
      auVar84._4_60_ = auVar85._4_60_;
      auVar84._0_4_ = (float)((uint)bVar29 * -0x40800000 + (uint)!bVar29 * auVar241._0_4_);
      vucomiss_avx512f(auVar84._0_16_);
      if ((bVar26) || (bVar27)) {
        auVar47 = vucomiss_avx512f(auVar33);
        if ((bVar26) || (bVar27)) {
          auVar49 = vxorps_avx512vl(auVar33,auVar233._0_16_);
          auVar33 = vsubss_avx512f(auVar47,auVar33);
          auVar33 = vdivss_avx512f(auVar49,auVar33);
          auVar47 = vsubss_avx512f(ZEXT416(0x3f800000),auVar33);
          auVar47 = vfmadd213ss_avx512f(auVar47,auVar48,auVar33);
          auVar33 = auVar47;
        }
        else {
          auVar33 = vxorps_avx512vl(auVar47,auVar47);
          vucomiss_avx512f(auVar33);
          auVar47 = ZEXT416(0x3f800000);
          if ((bVar26) || (bVar27)) {
            auVar47 = SUB6416(ZEXT464(0xff800000),0);
            auVar33 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar46 = vminss_avx512f(auVar46,auVar33);
        auVar40 = vmaxss_avx(auVar47,auVar40);
      }
      auVar241 = ZEXT464(0x3f800000);
      uVar11 = vcmpss_avx512f(auVar34,auVar48,1);
      bVar29 = (bool)((byte)uVar11 & 1);
      auVar34 = auVar241._0_16_;
      fVar204 = (float)((uint)bVar29 * -0x40800000 + (uint)!bVar29 * 0x3f800000);
      if ((auVar78._0_4_ != fVar204) || (NAN(auVar78._0_4_) || NAN(fVar204))) {
        if ((fVar202 != fVar191) || (NAN(fVar202) || NAN(fVar191))) {
          auVar43 = vxorps_avx512vl(auVar43,auVar233._0_16_);
          auVar176._0_4_ = auVar43._0_4_ / (fVar202 - fVar191);
          auVar176._4_12_ = auVar43._4_12_;
          auVar43 = vsubss_avx512f(auVar34,auVar176);
          auVar43 = vfmadd213ss_avx512f(auVar43,auVar48,auVar176);
          auVar33 = auVar43;
        }
        else if ((fVar191 != 0.0) ||
                (auVar43 = auVar34, auVar33 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar191))) {
          auVar43 = SUB6416(ZEXT464(0xff800000),0);
          auVar33 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar46 = vminss_avx(auVar46,auVar33);
        auVar40 = vmaxss_avx(auVar43,auVar40);
      }
      bVar29 = auVar84._0_4_ != fVar204;
      auVar43 = vminss_avx512f(auVar46,auVar34);
      auVar87._16_48_ = auVar90._16_48_;
      auVar87._0_16_ = auVar46;
      auVar86._4_60_ = auVar87._4_60_;
      auVar86._0_4_ = (uint)bVar29 * auVar43._0_4_ + (uint)!bVar29 * auVar46._0_4_;
      auVar43 = vmaxss_avx512f(auVar34,auVar40);
      auVar89._16_48_ = auVar90._16_48_;
      auVar89._0_16_ = auVar40;
      auVar88._4_60_ = auVar89._4_60_;
      auVar88._0_4_ = (uint)bVar29 * auVar43._0_4_ + (uint)!bVar29 * auVar40._0_4_;
      auVar43 = vmaxss_avx512f(auVar48,auVar86._0_16_);
      auVar90._0_16_ = vminss_avx512f(auVar88._0_16_,auVar34);
    } while (auVar90._0_4_ < auVar43._0_4_);
    auVar49 = vmaxss_avx512f(auVar48,ZEXT416((uint)(auVar43._0_4_ + -0.1)));
    auVar44 = vminss_avx512f(ZEXT416((uint)(auVar90._0_4_ + 0.1)),auVar34);
    auVar123._0_8_ = auVar127._0_8_;
    auVar123._8_8_ = auVar123._0_8_;
    auVar194._8_8_ = auVar158._0_8_;
    auVar194._0_8_ = auVar158._0_8_;
    auVar212._8_8_ = auVar50._0_8_;
    auVar212._0_8_ = auVar50._0_8_;
    auVar43 = vshufpd_avx(auVar158,auVar158,3);
    auVar33 = vshufpd_avx(auVar50,auVar50,3);
    auVar40 = vshufps_avx(auVar49,auVar44,0);
    auVar50 = vsubps_avx512vl(auVar238,auVar40);
    fVar191 = auVar40._0_4_;
    auVar152._0_4_ = fVar191 * auVar51._0_4_;
    fVar202 = auVar40._4_4_;
    auVar152._4_4_ = fVar202 * auVar51._4_4_;
    fVar204 = auVar40._8_4_;
    auVar152._8_4_ = fVar204 * auVar51._8_4_;
    fVar206 = auVar40._12_4_;
    auVar152._12_4_ = fVar206 * auVar51._12_4_;
    auVar159._0_4_ = fVar191 * auVar43._0_4_;
    auVar159._4_4_ = fVar202 * auVar43._4_4_;
    auVar159._8_4_ = fVar204 * auVar43._8_4_;
    auVar159._12_4_ = fVar206 * auVar43._12_4_;
    auVar228._0_4_ = auVar33._0_4_ * fVar191;
    auVar228._4_4_ = auVar33._4_4_ * fVar202;
    auVar228._8_4_ = auVar33._8_4_ * fVar204;
    auVar228._12_4_ = auVar33._12_4_ * fVar206;
    auVar144._0_4_ = fVar191 * auVar53._0_4_;
    auVar144._4_4_ = fVar202 * auVar53._4_4_;
    auVar144._8_4_ = fVar204 * auVar53._8_4_;
    auVar144._12_4_ = fVar206 * auVar53._12_4_;
    auVar53 = vfmadd231ps_fma(auVar152,auVar50,auVar123);
    auVar46 = vfmadd231ps_fma(auVar159,auVar50,auVar194);
    auVar47 = vfmadd231ps_fma(auVar228,auVar50,auVar212);
    auVar50 = vfmadd231ps_fma(auVar144,auVar50,ZEXT816(0));
    auVar33 = vsubss_avx512f(auVar34,auVar49);
    auVar43 = vmovshdup_avx(auVar104);
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * auVar49._0_4_)),auVar104,auVar33);
    auVar33 = vsubss_avx512f(auVar34,auVar44);
    auVar149 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * auVar44._0_4_)),auVar104,auVar33);
    auVar49 = vdivss_avx512f(auVar34,ZEXT416((uint)fVar207));
    auVar43 = vsubps_avx(auVar46,auVar53);
    auVar220 = auVar101._0_16_;
    auVar40 = vmulps_avx512vl(auVar43,auVar220);
    auVar43 = vsubps_avx(auVar47,auVar46);
    auVar51 = vmulps_avx512vl(auVar43,auVar220);
    auVar43 = vsubps_avx(auVar50,auVar47);
    auVar43 = vmulps_avx512vl(auVar43,auVar220);
    auVar33 = vminps_avx(auVar51,auVar43);
    auVar43 = vmaxps_avx(auVar51,auVar43);
    auVar33 = vminps_avx(auVar40,auVar33);
    auVar43 = vmaxps_avx(auVar40,auVar43);
    auVar40 = vshufpd_avx(auVar33,auVar33,3);
    auVar51 = vshufpd_avx(auVar43,auVar43,3);
    auVar33 = vminps_avx(auVar33,auVar40);
    auVar43 = vmaxps_avx(auVar43,auVar51);
    fVar207 = auVar49._0_4_;
    auVar177._0_4_ = auVar33._0_4_ * fVar207;
    auVar177._4_4_ = auVar33._4_4_ * fVar207;
    auVar177._8_4_ = auVar33._8_4_ * fVar207;
    auVar177._12_4_ = auVar33._12_4_ * fVar207;
    auVar168._0_4_ = fVar207 * auVar43._0_4_;
    auVar168._4_4_ = fVar207 * auVar43._4_4_;
    auVar168._8_4_ = fVar207 * auVar43._8_4_;
    auVar168._12_4_ = fVar207 * auVar43._12_4_;
    auVar49 = vdivss_avx512f(auVar34,ZEXT416((uint)(auVar149._0_4_ - auVar45._0_4_)));
    auVar43 = vshufpd_avx(auVar53,auVar53,3);
    auVar33 = vshufpd_avx(auVar46,auVar46,3);
    auVar40 = vshufpd_avx(auVar47,auVar47,3);
    auVar51 = vshufpd_avx(auVar50,auVar50,3);
    auVar43 = vsubps_avx(auVar43,auVar53);
    auVar53 = vsubps_avx(auVar33,auVar46);
    auVar46 = vsubps_avx(auVar40,auVar47);
    auVar51 = vsubps_avx(auVar51,auVar50);
    auVar33 = vminps_avx(auVar43,auVar53);
    auVar43 = vmaxps_avx(auVar43,auVar53);
    auVar40 = vminps_avx(auVar46,auVar51);
    auVar40 = vminps_avx(auVar33,auVar40);
    auVar33 = vmaxps_avx(auVar46,auVar51);
    auVar43 = vmaxps_avx(auVar43,auVar33);
    fVar207 = auVar49._0_4_;
    auVar213._0_4_ = fVar207 * auVar40._0_4_;
    auVar213._4_4_ = fVar207 * auVar40._4_4_;
    auVar213._8_4_ = fVar207 * auVar40._8_4_;
    auVar213._12_4_ = fVar207 * auVar40._12_4_;
    auVar195._0_4_ = fVar207 * auVar43._0_4_;
    auVar195._4_4_ = fVar207 * auVar43._4_4_;
    auVar195._8_4_ = fVar207 * auVar43._8_4_;
    auVar195._12_4_ = fVar207 * auVar43._12_4_;
    auVar51 = vinsertps_avx(auVar30,auVar45,0x10);
    auVar52 = vpermt2ps_avx512vl(auVar30,_DAT_01fb9f90,auVar149);
    auVar105._0_4_ = auVar51._0_4_ + auVar52._0_4_;
    auVar105._4_4_ = auVar51._4_4_ + auVar52._4_4_;
    auVar105._8_4_ = auVar51._8_4_ + auVar52._8_4_;
    auVar105._12_4_ = auVar51._12_4_ + auVar52._12_4_;
    auVar15._8_4_ = 0x3f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar15._12_4_ = 0x3f000000;
    auVar49 = vmulps_avx512vl(auVar105,auVar15);
    auVar33 = vshufps_avx(auVar49,auVar49,0x54);
    uVar92 = auVar49._0_4_;
    auVar117._4_4_ = uVar92;
    auVar117._0_4_ = uVar92;
    auVar117._8_4_ = uVar92;
    auVar117._12_4_ = uVar92;
    auVar40 = vfmadd213ps_fma(local_470,auVar117,auVar32);
    auVar53 = vfmadd213ps_fma(local_480,auVar117,auVar41);
    auVar46 = vfmadd213ps_fma(local_490,auVar117,auVar38);
    auVar43 = vsubps_avx(auVar53,auVar40);
    auVar40 = vfmadd213ps_fma(auVar43,auVar117,auVar40);
    auVar43 = vsubps_avx(auVar46,auVar53);
    auVar43 = vfmadd213ps_fma(auVar43,auVar117,auVar53);
    auVar43 = vsubps_avx(auVar43,auVar40);
    auVar40 = vfmadd231ps_fma(auVar40,auVar43,auVar117);
    auVar47 = vmulps_avx512vl(auVar43,auVar220);
    auVar222._8_8_ = auVar40._0_8_;
    auVar222._0_8_ = auVar40._0_8_;
    auVar43 = vshufpd_avx(auVar40,auVar40,3);
    auVar40 = vshufps_avx(auVar49,auVar49,0x55);
    auVar53 = vsubps_avx(auVar43,auVar222);
    auVar46 = vfmadd231ps_fma(auVar222,auVar40,auVar53);
    auVar229._8_8_ = auVar47._0_8_;
    auVar229._0_8_ = auVar47._0_8_;
    auVar43 = vshufpd_avx(auVar47,auVar47,3);
    auVar43 = vsubps_avx512vl(auVar43,auVar229);
    auVar43 = vfmadd213ps_avx512vl(auVar43,auVar40,auVar229);
    auVar118._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
    auVar118._8_4_ = auVar53._8_4_ ^ 0x80000000;
    auVar118._12_4_ = auVar53._12_4_ ^ 0x80000000;
    auVar40 = vmovshdup_avx512vl(auVar43);
    auVar230._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
    auVar230._8_4_ = auVar40._8_4_ ^ 0x80000000;
    auVar230._12_4_ = auVar40._12_4_ ^ 0x80000000;
    auVar47 = vmovshdup_avx512vl(auVar53);
    auVar50 = vpermt2ps_avx512vl(auVar230,ZEXT416(5),auVar53);
    auVar240 = ZEXT464(0x40400000);
    auVar40 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar53._0_4_)),auVar43,auVar47);
    auVar53 = vpermt2ps_avx512vl(auVar43,SUB6416(ZEXT464(4),0),auVar118);
    auVar145._0_4_ = auVar40._0_4_;
    auVar145._4_4_ = auVar145._0_4_;
    auVar145._8_4_ = auVar145._0_4_;
    auVar145._12_4_ = auVar145._0_4_;
    auVar43 = vdivps_avx(auVar50,auVar145);
    auVar54 = vdivps_avx512vl(auVar53,auVar145);
    fVar207 = auVar46._0_4_;
    auVar40 = vshufps_avx(auVar46,auVar46,0x55);
    auVar223._0_4_ = fVar207 * auVar43._0_4_ + auVar40._0_4_ * auVar54._0_4_;
    auVar223._4_4_ = fVar207 * auVar43._4_4_ + auVar40._4_4_ * auVar54._4_4_;
    auVar223._8_4_ = fVar207 * auVar43._8_4_ + auVar40._8_4_ * auVar54._8_4_;
    auVar223._12_4_ = fVar207 * auVar43._12_4_ + auVar40._12_4_ * auVar54._12_4_;
    auVar127 = vsubps_avx(auVar33,auVar223);
    auVar40 = vmovshdup_avx(auVar43);
    auVar33 = vinsertps_avx(auVar177,auVar213,0x1c);
    auVar231._0_4_ = auVar40._0_4_ * auVar33._0_4_;
    auVar231._4_4_ = auVar40._4_4_ * auVar33._4_4_;
    auVar231._8_4_ = auVar40._8_4_ * auVar33._8_4_;
    auVar231._12_4_ = auVar40._12_4_ * auVar33._12_4_;
    auVar44 = vinsertps_avx512f(auVar168,auVar195,0x1c);
    auVar40 = vmulps_avx512vl(auVar40,auVar44);
    auVar50 = vminps_avx512vl(auVar231,auVar40);
    auVar46 = vmaxps_avx(auVar40,auVar231);
    auVar47 = vmovshdup_avx(auVar54);
    auVar40 = vinsertps_avx(auVar213,auVar177,0x4c);
    auVar214._0_4_ = auVar47._0_4_ * auVar40._0_4_;
    auVar214._4_4_ = auVar47._4_4_ * auVar40._4_4_;
    auVar214._8_4_ = auVar47._8_4_ * auVar40._8_4_;
    auVar214._12_4_ = auVar47._12_4_ * auVar40._12_4_;
    auVar53 = vinsertps_avx(auVar195,auVar168,0x4c);
    auVar196._0_4_ = auVar47._0_4_ * auVar53._0_4_;
    auVar196._4_4_ = auVar47._4_4_ * auVar53._4_4_;
    auVar196._8_4_ = auVar47._8_4_ * auVar53._8_4_;
    auVar196._12_4_ = auVar47._12_4_ * auVar53._12_4_;
    auVar47 = vminps_avx(auVar214,auVar196);
    auVar50 = vaddps_avx512vl(auVar50,auVar47);
    auVar47 = vmaxps_avx(auVar196,auVar214);
    auVar197._0_4_ = auVar46._0_4_ + auVar47._0_4_;
    auVar197._4_4_ = auVar46._4_4_ + auVar47._4_4_;
    auVar197._8_4_ = auVar46._8_4_ + auVar47._8_4_;
    auVar197._12_4_ = auVar46._12_4_ + auVar47._12_4_;
    auVar215._8_8_ = 0x3f80000000000000;
    auVar215._0_8_ = 0x3f80000000000000;
    auVar46 = vsubps_avx(auVar215,auVar197);
    auVar47 = vsubps_avx(auVar215,auVar50);
    auVar50 = vsubps_avx(auVar51,auVar49);
    auVar49 = vsubps_avx(auVar52,auVar49);
    fVar206 = auVar50._0_4_;
    auVar232._0_4_ = fVar206 * auVar46._0_4_;
    fVar190 = auVar50._4_4_;
    auVar232._4_4_ = fVar190 * auVar46._4_4_;
    fVar201 = auVar50._8_4_;
    auVar232._8_4_ = fVar201 * auVar46._8_4_;
    fVar208 = auVar50._12_4_;
    auVar232._12_4_ = fVar208 * auVar46._12_4_;
    auVar55 = vbroadcastss_avx512vl(auVar43);
    auVar33 = vmulps_avx512vl(auVar55,auVar33);
    auVar44 = vmulps_avx512vl(auVar55,auVar44);
    auVar55 = vminps_avx512vl(auVar33,auVar44);
    auVar44 = vmaxps_avx512vl(auVar44,auVar33);
    auVar33 = vbroadcastss_avx512vl(auVar54);
    auVar40 = vmulps_avx512vl(auVar33,auVar40);
    auVar33 = vmulps_avx512vl(auVar33,auVar53);
    auVar53 = vminps_avx512vl(auVar40,auVar33);
    auVar53 = vaddps_avx512vl(auVar55,auVar53);
    auVar50 = vmulps_avx512vl(auVar50,auVar47);
    fVar207 = auVar49._0_4_;
    auVar198._0_4_ = fVar207 * auVar46._0_4_;
    fVar191 = auVar49._4_4_;
    auVar198._4_4_ = fVar191 * auVar46._4_4_;
    fVar202 = auVar49._8_4_;
    auVar198._8_4_ = fVar202 * auVar46._8_4_;
    fVar204 = auVar49._12_4_;
    auVar198._12_4_ = fVar204 * auVar46._12_4_;
    auVar216._0_4_ = fVar207 * auVar47._0_4_;
    auVar216._4_4_ = fVar191 * auVar47._4_4_;
    auVar216._8_4_ = fVar202 * auVar47._8_4_;
    auVar216._12_4_ = fVar204 * auVar47._12_4_;
    auVar33 = vmaxps_avx(auVar33,auVar40);
    auVar169._0_4_ = auVar44._0_4_ + auVar33._0_4_;
    auVar169._4_4_ = auVar44._4_4_ + auVar33._4_4_;
    auVar169._8_4_ = auVar44._8_4_ + auVar33._8_4_;
    auVar169._12_4_ = auVar44._12_4_ + auVar33._12_4_;
    auVar178._8_8_ = 0x3f800000;
    auVar178._0_8_ = 0x3f800000;
    auVar33 = vsubps_avx(auVar178,auVar169);
    auVar40 = vsubps_avx512vl(auVar178,auVar53);
    auVar227._0_4_ = fVar206 * auVar33._0_4_;
    auVar227._4_4_ = fVar190 * auVar33._4_4_;
    auVar227._8_4_ = fVar201 * auVar33._8_4_;
    auVar227._12_4_ = fVar208 * auVar33._12_4_;
    auVar224._0_4_ = fVar206 * auVar40._0_4_;
    auVar224._4_4_ = fVar190 * auVar40._4_4_;
    auVar224._8_4_ = fVar201 * auVar40._8_4_;
    auVar224._12_4_ = fVar208 * auVar40._12_4_;
    auVar170._0_4_ = fVar207 * auVar33._0_4_;
    auVar170._4_4_ = fVar191 * auVar33._4_4_;
    auVar170._8_4_ = fVar202 * auVar33._8_4_;
    auVar170._12_4_ = fVar204 * auVar33._12_4_;
    auVar179._0_4_ = fVar207 * auVar40._0_4_;
    auVar179._4_4_ = fVar191 * auVar40._4_4_;
    auVar179._8_4_ = fVar202 * auVar40._8_4_;
    auVar179._12_4_ = fVar204 * auVar40._12_4_;
    auVar33 = vminps_avx(auVar227,auVar224);
    auVar40 = vminps_avx512vl(auVar170,auVar179);
    auVar53 = vminps_avx512vl(auVar33,auVar40);
    auVar33 = vmaxps_avx(auVar224,auVar227);
    auVar40 = vmaxps_avx(auVar179,auVar170);
    auVar40 = vmaxps_avx(auVar40,auVar33);
    auVar46 = vminps_avx512vl(auVar232,auVar50);
    auVar33 = vminps_avx(auVar198,auVar216);
    auVar33 = vminps_avx(auVar46,auVar33);
    auVar33 = vhaddps_avx(auVar53,auVar33);
    auVar90._0_16_ = vmaxps_avx512vl(auVar50,auVar232);
    auVar53 = vmaxps_avx(auVar216,auVar198);
    auVar53 = vmaxps_avx(auVar53,auVar90._0_16_);
    auVar40 = vhaddps_avx(auVar40,auVar53);
    auVar33 = vshufps_avx(auVar33,auVar33,0xe8);
    auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
    auVar171._0_4_ = auVar33._0_4_ + auVar127._0_4_;
    auVar171._4_4_ = auVar33._4_4_ + auVar127._4_4_;
    auVar171._8_4_ = auVar33._8_4_ + auVar127._8_4_;
    auVar171._12_4_ = auVar33._12_4_ + auVar127._12_4_;
    auVar180._0_4_ = auVar40._0_4_ + auVar127._0_4_;
    auVar180._4_4_ = auVar40._4_4_ + auVar127._4_4_;
    auVar180._8_4_ = auVar40._8_4_ + auVar127._8_4_;
    auVar180._12_4_ = auVar40._12_4_ + auVar127._12_4_;
    auVar33 = vmaxps_avx(auVar51,auVar171);
    auVar40 = vminps_avx(auVar180,auVar52);
    uVar1 = vcmpps_avx512vl(auVar40,auVar33,1);
  } while ((uVar1 & 3) != 0);
  uVar1 = vcmpps_avx512vl(auVar180,auVar52,1);
  uVar11 = vcmpps_avx512vl(auVar30,auVar171,1);
  if (((ushort)uVar11 & (ushort)uVar1 & 1) == 0) {
    bVar18 = 0;
  }
  else {
    auVar33 = vmovshdup_avx(auVar171);
    bVar18 = auVar45._0_4_ < auVar33._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar20 || uVar5 != 0 && !bVar28) | bVar18) != 1) goto LAB_017e6efe;
  lVar22 = 0xc9;
  do {
    lVar22 = lVar22 + -1;
    if (lVar22 == 0) goto LAB_017e6065;
    auVar30 = vsubss_avx512f(auVar34,auVar127);
    fVar202 = auVar30._0_4_;
    fVar207 = fVar202 * fVar202 * fVar202;
    auVar30 = vmulss_avx512f(auVar127,ZEXT416(0x40400000));
    fVar191 = auVar30._0_4_ * fVar202 * fVar202;
    fVar204 = auVar127._0_4_;
    auVar30 = vmulss_avx512f(ZEXT416((uint)(fVar204 * fVar204)),ZEXT416(0x40400000));
    fVar202 = fVar202 * auVar30._0_4_;
    auVar133._4_4_ = fVar207;
    auVar133._0_4_ = fVar207;
    auVar133._8_4_ = fVar207;
    auVar133._12_4_ = fVar207;
    auVar124._4_4_ = fVar191;
    auVar124._0_4_ = fVar191;
    auVar124._8_4_ = fVar191;
    auVar124._12_4_ = fVar191;
    auVar98._4_4_ = fVar202;
    auVar98._0_4_ = fVar202;
    auVar98._8_4_ = fVar202;
    auVar98._12_4_ = fVar202;
    fVar204 = fVar204 * fVar204 * fVar204;
    auVar153._0_4_ = (float)local_4a0._0_4_ * fVar204;
    auVar153._4_4_ = (float)local_4a0._4_4_ * fVar204;
    auVar153._8_4_ = fStack_498 * fVar204;
    auVar153._12_4_ = fStack_494 * fVar204;
    auVar30 = vfmadd231ps_fma(auVar153,auVar38,auVar98);
    auVar30 = vfmadd231ps_fma(auVar30,auVar41,auVar124);
    auVar30 = vfmadd231ps_fma(auVar30,auVar32,auVar133);
    auVar99._8_8_ = auVar30._0_8_;
    auVar99._0_8_ = auVar30._0_8_;
    auVar30 = vshufpd_avx(auVar30,auVar30,3);
    auVar33 = vshufps_avx(auVar127,auVar127,0x55);
    auVar30 = vsubps_avx(auVar30,auVar99);
    auVar33 = vfmadd213ps_fma(auVar30,auVar33,auVar99);
    fVar207 = auVar33._0_4_;
    auVar30 = vshufps_avx(auVar33,auVar33,0x55);
    auVar100._0_4_ = auVar43._0_4_ * fVar207 + auVar54._0_4_ * auVar30._0_4_;
    auVar100._4_4_ = auVar43._4_4_ * fVar207 + auVar54._4_4_ * auVar30._4_4_;
    auVar100._8_4_ = auVar43._8_4_ * fVar207 + auVar54._8_4_ * auVar30._8_4_;
    auVar100._12_4_ = auVar43._12_4_ * fVar207 + auVar54._12_4_ * auVar30._12_4_;
    auVar127 = vsubps_avx(auVar127,auVar100);
    auVar30 = vandps_avx512vl(auVar33,auVar237._0_16_);
    auVar90._0_16_ = vprolq_avx512vl(auVar30,0x20);
    auVar30 = vmaxss_avx(auVar90._0_16_,auVar30);
    bVar28 = (float)local_4b0._0_4_ < auVar30._0_4_;
  } while ((float)local_4b0._0_4_ <= auVar30._0_4_);
  auVar30 = vucomiss_avx512f(auVar48);
  if (bVar28) goto LAB_017e6065;
  auVar43 = vucomiss_avx512f(auVar30);
  auVar241 = ZEXT1664(auVar43);
  if (bVar28) goto LAB_017e6065;
  vmovshdup_avx(auVar30);
  auVar43 = vucomiss_avx512f(auVar48);
  if (bVar28) goto LAB_017e6065;
  auVar34 = vucomiss_avx512f(auVar43);
  auVar241 = ZEXT1664(auVar34);
  if (bVar28) goto LAB_017e6065;
  auVar33 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar48 = vinsertps_avx(auVar33,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar33 = vdpps_avx(auVar48,local_4c0,0x7f);
  auVar40 = vdpps_avx(auVar48,local_4d0,0x7f);
  auVar51 = vdpps_avx(auVar48,local_4e0,0x7f);
  auVar53 = vdpps_avx(auVar48,local_4f0,0x7f);
  auVar46 = vdpps_avx(auVar48,local_500,0x7f);
  auVar47 = vdpps_avx(auVar48,local_510,0x7f);
  auVar50 = vdpps_avx(auVar48,local_520,0x7f);
  auVar48 = vdpps_avx(auVar48,local_530,0x7f);
  auVar49 = vsubss_avx512f(auVar34,auVar43);
  fVar207 = auVar43._0_4_;
  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar46._0_4_)),auVar49,auVar33);
  auVar33 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * fVar207)),auVar49,auVar40);
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar207)),auVar49,auVar51);
  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar48._0_4_)),auVar49,auVar53);
  auVar34 = vsubss_avx512f(auVar34,auVar30);
  auVar154._0_4_ = auVar34._0_4_;
  fVar191 = auVar154._0_4_ * auVar154._0_4_ * auVar154._0_4_;
  auVar34 = vmulss_avx512f(auVar30,ZEXT416(0x40400000));
  fVar202 = auVar34._0_4_ * auVar154._0_4_ * auVar154._0_4_;
  fVar207 = auVar30._0_4_;
  auVar146._0_4_ = fVar207 * fVar207;
  auVar146._4_4_ = auVar30._4_4_ * auVar30._4_4_;
  auVar146._8_4_ = auVar30._8_4_ * auVar30._8_4_;
  auVar146._12_4_ = auVar30._12_4_ * auVar30._12_4_;
  auVar90._0_16_ = vmulss_avx512f(auVar146,ZEXT416(0x40400000));
  fVar204 = auVar154._0_4_ * auVar90._0_4_;
  fVar190 = fVar207 * auVar146._0_4_;
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * auVar51._0_4_)),ZEXT416((uint)fVar204),auVar40)
  ;
  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar202),auVar33);
  auVar43 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar191),auVar43);
  fVar206 = auVar43._0_4_;
  if ((fVar206 < fVar91) || (fVar201 = *(float *)(ray + k * 4 + 0x200), fVar201 < fVar206))
  goto LAB_017e6065;
  auVar43 = vshufps_avx(auVar30,auVar30,0x55);
  auVar33 = vsubps_avx512vl(auVar238,auVar43);
  fVar208 = auVar43._0_4_;
  auVar181._0_4_ = fVar208 * (float)local_550._0_4_;
  fVar217 = auVar43._4_4_;
  auVar181._4_4_ = fVar217 * (float)local_550._4_4_;
  fVar218 = auVar43._8_4_;
  auVar181._8_4_ = fVar218 * fStack_548;
  fVar219 = auVar43._12_4_;
  auVar181._12_4_ = fVar219 * fStack_544;
  auVar188._0_4_ = fVar208 * (float)local_5a0._0_4_;
  auVar188._4_4_ = fVar217 * (float)local_5a0._4_4_;
  auVar188._8_4_ = fVar218 * fStack_598;
  auVar188._12_4_ = fVar219 * fStack_594;
  auVar199._0_4_ = fVar208 * (float)local_5b0._0_4_;
  auVar199._4_4_ = fVar217 * (float)local_5b0._4_4_;
  auVar199._8_4_ = fVar218 * fStack_5a8;
  auVar199._12_4_ = fVar219 * fStack_5a4;
  auVar160._0_4_ = fVar208 * (float)local_570._0_4_;
  auVar160._4_4_ = fVar217 * (float)local_570._4_4_;
  auVar160._8_4_ = fVar218 * fStack_568;
  auVar160._12_4_ = fVar219 * fStack_564;
  auVar43 = vfmadd231ps_fma(auVar181,auVar33,local_540);
  auVar238 = vfmadd231ps_fma(auVar188,auVar33,local_580);
  auVar34 = vfmadd231ps_fma(auVar199,auVar33,local_590);
  auVar33 = vfmadd231ps_fma(auVar160,auVar33,local_560);
  auVar43 = vsubps_avx(auVar238,auVar43);
  auVar238 = vsubps_avx(auVar34,auVar238);
  auVar34 = vsubps_avx(auVar33,auVar34);
  auVar200._0_4_ = fVar207 * auVar238._0_4_;
  auVar200._4_4_ = fVar207 * auVar238._4_4_;
  auVar200._8_4_ = fVar207 * auVar238._8_4_;
  auVar200._12_4_ = fVar207 * auVar238._12_4_;
  auVar154._4_4_ = auVar154._0_4_;
  auVar154._8_4_ = auVar154._0_4_;
  auVar154._12_4_ = auVar154._0_4_;
  auVar43 = vfmadd231ps_fma(auVar200,auVar154,auVar43);
  auVar161._0_4_ = fVar207 * auVar34._0_4_;
  auVar161._4_4_ = fVar207 * auVar34._4_4_;
  auVar161._8_4_ = fVar207 * auVar34._8_4_;
  auVar161._12_4_ = fVar207 * auVar34._12_4_;
  auVar238 = vfmadd231ps_fma(auVar161,auVar154,auVar238);
  auVar162._0_4_ = fVar207 * auVar238._0_4_;
  auVar162._4_4_ = fVar207 * auVar238._4_4_;
  auVar162._8_4_ = fVar207 * auVar238._8_4_;
  auVar162._12_4_ = fVar207 * auVar238._12_4_;
  auVar43 = vfmadd231ps_fma(auVar162,auVar154,auVar43);
  auVar90._0_16_ = vmulps_avx512vl(auVar43,auVar220);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar18 = 1, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_017e6ee1;
    auVar147._0_4_ = fVar190 * (float)local_600._0_4_;
    auVar147._4_4_ = fVar190 * (float)local_600._4_4_;
    auVar147._8_4_ = fVar190 * fStack_5f8;
    auVar147._12_4_ = fVar190 * fStack_5f4;
    auVar134._4_4_ = fVar204;
    auVar134._0_4_ = fVar204;
    auVar134._8_4_ = fVar204;
    auVar134._12_4_ = fVar204;
    auVar43 = vfmadd132ps_fma(auVar134,auVar147,local_5f0);
    auVar125._4_4_ = fVar202;
    auVar125._0_4_ = fVar202;
    auVar125._8_4_ = fVar202;
    auVar125._12_4_ = fVar202;
    auVar43 = vfmadd132ps_fma(auVar125,auVar43,local_5e0);
    auVar119._4_4_ = fVar191;
    auVar119._0_4_ = fVar191;
    auVar119._8_4_ = fVar191;
    auVar119._12_4_ = fVar191;
    auVar34 = vfmadd132ps_fma(auVar119,auVar43,local_5d0);
    auVar43 = vshufps_avx(auVar34,auVar34,0xc9);
    auVar238 = vshufps_avx(auVar90._0_16_,auVar90._0_16_,0xc9);
    auVar120._0_4_ = auVar34._0_4_ * auVar238._0_4_;
    auVar120._4_4_ = auVar34._4_4_ * auVar238._4_4_;
    auVar120._8_4_ = auVar34._8_4_ * auVar238._8_4_;
    auVar120._12_4_ = auVar34._12_4_ * auVar238._12_4_;
    auVar43 = vfmsub231ps_fma(auVar120,auVar90._0_16_,auVar43);
    local_200 = vbroadcastss_avx512f(auVar30);
    auVar77 = vbroadcastss_avx512f(ZEXT416(1));
    local_1c0 = vpermps_avx512f(auVar77,ZEXT1664(auVar30));
    auVar77 = vpermps_avx512f(auVar77,ZEXT1664(auVar43));
    auVar90 = vbroadcastss_avx512f(ZEXT416(2));
    local_280 = vpermps_avx512f(auVar90,ZEXT1664(auVar43));
    local_240 = vbroadcastss_avx512f(auVar43);
    local_2c0[0] = (RTCHitN)auVar77[0];
    local_2c0[1] = (RTCHitN)auVar77[1];
    local_2c0[2] = (RTCHitN)auVar77[2];
    local_2c0[3] = (RTCHitN)auVar77[3];
    local_2c0[4] = (RTCHitN)auVar77[4];
    local_2c0[5] = (RTCHitN)auVar77[5];
    local_2c0[6] = (RTCHitN)auVar77[6];
    local_2c0[7] = (RTCHitN)auVar77[7];
    local_2c0[8] = (RTCHitN)auVar77[8];
    local_2c0[9] = (RTCHitN)auVar77[9];
    local_2c0[10] = (RTCHitN)auVar77[10];
    local_2c0[0xb] = (RTCHitN)auVar77[0xb];
    local_2c0[0xc] = (RTCHitN)auVar77[0xc];
    local_2c0[0xd] = (RTCHitN)auVar77[0xd];
    local_2c0[0xe] = (RTCHitN)auVar77[0xe];
    local_2c0[0xf] = (RTCHitN)auVar77[0xf];
    local_2c0[0x10] = (RTCHitN)auVar77[0x10];
    local_2c0[0x11] = (RTCHitN)auVar77[0x11];
    local_2c0[0x12] = (RTCHitN)auVar77[0x12];
    local_2c0[0x13] = (RTCHitN)auVar77[0x13];
    local_2c0[0x14] = (RTCHitN)auVar77[0x14];
    local_2c0[0x15] = (RTCHitN)auVar77[0x15];
    local_2c0[0x16] = (RTCHitN)auVar77[0x16];
    local_2c0[0x17] = (RTCHitN)auVar77[0x17];
    local_2c0[0x18] = (RTCHitN)auVar77[0x18];
    local_2c0[0x19] = (RTCHitN)auVar77[0x19];
    local_2c0[0x1a] = (RTCHitN)auVar77[0x1a];
    local_2c0[0x1b] = (RTCHitN)auVar77[0x1b];
    local_2c0[0x1c] = (RTCHitN)auVar77[0x1c];
    local_2c0[0x1d] = (RTCHitN)auVar77[0x1d];
    local_2c0[0x1e] = (RTCHitN)auVar77[0x1e];
    local_2c0[0x1f] = (RTCHitN)auVar77[0x1f];
    local_2c0[0x20] = (RTCHitN)auVar77[0x20];
    local_2c0[0x21] = (RTCHitN)auVar77[0x21];
    local_2c0[0x22] = (RTCHitN)auVar77[0x22];
    local_2c0[0x23] = (RTCHitN)auVar77[0x23];
    local_2c0[0x24] = (RTCHitN)auVar77[0x24];
    local_2c0[0x25] = (RTCHitN)auVar77[0x25];
    local_2c0[0x26] = (RTCHitN)auVar77[0x26];
    local_2c0[0x27] = (RTCHitN)auVar77[0x27];
    local_2c0[0x28] = (RTCHitN)auVar77[0x28];
    local_2c0[0x29] = (RTCHitN)auVar77[0x29];
    local_2c0[0x2a] = (RTCHitN)auVar77[0x2a];
    local_2c0[0x2b] = (RTCHitN)auVar77[0x2b];
    local_2c0[0x2c] = (RTCHitN)auVar77[0x2c];
    local_2c0[0x2d] = (RTCHitN)auVar77[0x2d];
    local_2c0[0x2e] = (RTCHitN)auVar77[0x2e];
    local_2c0[0x2f] = (RTCHitN)auVar77[0x2f];
    local_2c0[0x30] = (RTCHitN)auVar77[0x30];
    local_2c0[0x31] = (RTCHitN)auVar77[0x31];
    local_2c0[0x32] = (RTCHitN)auVar77[0x32];
    local_2c0[0x33] = (RTCHitN)auVar77[0x33];
    local_2c0[0x34] = (RTCHitN)auVar77[0x34];
    local_2c0[0x35] = (RTCHitN)auVar77[0x35];
    local_2c0[0x36] = (RTCHitN)auVar77[0x36];
    local_2c0[0x37] = (RTCHitN)auVar77[0x37];
    local_2c0[0x38] = (RTCHitN)auVar77[0x38];
    local_2c0[0x39] = (RTCHitN)auVar77[0x39];
    local_2c0[0x3a] = (RTCHitN)auVar77[0x3a];
    local_2c0[0x3b] = (RTCHitN)auVar77[0x3b];
    local_2c0[0x3c] = (RTCHitN)auVar77[0x3c];
    local_2c0[0x3d] = (RTCHitN)auVar77[0x3d];
    local_2c0[0x3e] = (RTCHitN)auVar77[0x3e];
    local_2c0[0x3f] = (RTCHitN)auVar77[0x3f];
    local_180 = local_300._0_8_;
    uStack_178 = local_300._8_8_;
    uStack_170 = local_300._16_8_;
    uStack_168 = local_300._24_8_;
    uStack_160 = local_300._32_8_;
    uStack_158 = local_300._40_8_;
    uStack_150 = local_300._48_8_;
    uStack_148 = local_300._56_8_;
    auVar77 = vmovdqa64_avx512f(local_340);
    local_140 = vmovdqa64_avx512f(auVar77);
    vpcmpeqd_avx2(auVar77._0_32_,auVar77._0_32_);
    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
    *(float *)(ray + k * 4 + 0x200) = fVar206;
    auVar90 = vmovdqa64_avx512f(local_380);
    local_400 = vmovdqa64_avx512f(auVar90);
    local_630.valid = (int *)local_400;
    local_630.geometryUserPtr = pGVar6->userPtr;
    local_630.context = context->user;
    local_630.ray = (RTCRayN *)ray;
    local_630.hit = local_2c0;
    local_630.N = 0x10;
    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar6->occlusionFilterN)(&local_630);
      auVar241 = ZEXT464(0x3f800000);
      auVar236 = ZEXT3264(_DAT_01fb9fe0);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar235 = ZEXT1664(auVar30);
      auVar77._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar234 = ZEXT3264(auVar77._32_32_);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar233 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar101 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar239 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar237 = ZEXT1664(auVar30);
      auVar90 = vmovdqa64_avx512f(local_400);
    }
    uVar11 = vptestmd_avx512f(auVar90,auVar90);
    if ((short)uVar11 != 0) {
      p_Var9 = context->args->filter;
      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var9)(&local_630);
        auVar241 = ZEXT464(0x3f800000);
        auVar236 = ZEXT3264(_DAT_01fb9fe0);
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar235 = ZEXT1664(auVar30);
        auVar77._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar234 = ZEXT3264(auVar77._32_32_);
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar233 = ZEXT1664(auVar30);
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar101 = ZEXT1664(auVar30);
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar239 = ZEXT1664(auVar30);
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar237 = ZEXT1664(auVar30);
        auVar90 = vmovdqa64_avx512f(local_400);
      }
      uVar1 = vptestmd_avx512f(auVar90,auVar90);
      auVar77 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar28 = (bool)((byte)uVar1 & 1);
      auVar90._0_4_ = (uint)bVar28 * auVar77._0_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x200)
      ;
      bVar28 = (bool)((byte)(uVar1 >> 1) & 1);
      auVar90._4_4_ = (uint)bVar28 * auVar77._4_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x204)
      ;
      bVar28 = (bool)((byte)(uVar1 >> 2) & 1);
      auVar90._8_4_ = (uint)bVar28 * auVar77._8_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x208)
      ;
      bVar28 = (bool)((byte)(uVar1 >> 3) & 1);
      auVar90._12_4_ =
           (uint)bVar28 * auVar77._12_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x20c);
      bVar28 = (bool)((byte)(uVar1 >> 4) & 1);
      auVar90._16_4_ =
           (uint)bVar28 * auVar77._16_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x210);
      bVar28 = (bool)((byte)(uVar1 >> 5) & 1);
      auVar90._20_4_ =
           (uint)bVar28 * auVar77._20_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x214);
      bVar28 = (bool)((byte)(uVar1 >> 6) & 1);
      auVar90._24_4_ =
           (uint)bVar28 * auVar77._24_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x218);
      bVar28 = (bool)((byte)(uVar1 >> 7) & 1);
      auVar90._28_4_ =
           (uint)bVar28 * auVar77._28_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x21c);
      bVar28 = (bool)((byte)(uVar1 >> 8) & 1);
      auVar90._32_4_ =
           (uint)bVar28 * auVar77._32_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x220);
      bVar28 = (bool)((byte)(uVar1 >> 9) & 1);
      auVar90._36_4_ =
           (uint)bVar28 * auVar77._36_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x224);
      bVar28 = (bool)((byte)(uVar1 >> 10) & 1);
      auVar90._40_4_ =
           (uint)bVar28 * auVar77._40_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x228);
      bVar28 = (bool)((byte)(uVar1 >> 0xb) & 1);
      auVar90._44_4_ =
           (uint)bVar28 * auVar77._44_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x22c);
      bVar28 = (bool)((byte)(uVar1 >> 0xc) & 1);
      auVar90._48_4_ =
           (uint)bVar28 * auVar77._48_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x230);
      bVar28 = (bool)((byte)(uVar1 >> 0xd) & 1);
      auVar90._52_4_ =
           (uint)bVar28 * auVar77._52_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x234);
      bVar28 = (bool)((byte)(uVar1 >> 0xe) & 1);
      auVar90._56_4_ =
           (uint)bVar28 * auVar77._56_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x238);
      bVar28 = SUB81(uVar1 >> 0xf,0);
      auVar90._60_4_ =
           (uint)bVar28 * auVar77._60_4_ | (uint)!bVar28 * *(int *)(local_630.ray + 0x23c);
      *(undefined1 (*) [64])(local_630.ray + 0x200) = auVar90;
      bVar18 = 1;
      if ((short)uVar1 != 0) goto LAB_017e6ee1;
    }
    *(float *)(ray + k * 4 + 0x200) = fVar201;
  }
  bVar18 = 0;
LAB_017e6ee1:
  bVar10 = (bool)(bVar10 | bVar18);
  goto LAB_017e6065;
LAB_017e6efe:
  auVar104 = vinsertps_avx(auVar45,auVar149,0x10);
  goto LAB_017e5b6f;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }